

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLABecLaplacian.cpp
# Opt level: O3

void __thiscall
amrex::MLABecLaplacian::Fsmooth
          (MLABecLaplacian *this,int amrlev,int mglev,MultiFab *sol,MultiFab *rhs,int redblack)

{
  size_t __n;
  undefined8 uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  pointer pIVar5;
  __uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> this_00;
  undefined1 auVar6 [16];
  int *piVar7;
  Long LVar8;
  int *piVar9;
  int *piVar10;
  Long LVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  Long LVar21;
  Long LVar22;
  MLABecLaplacian *pMVar23;
  double *pdVar24;
  double *pdVar25;
  double *pdVar26;
  Long LVar27;
  double *pdVar28;
  double *pdVar29;
  double *pdVar30;
  Long LVar31;
  double *pdVar32;
  Long LVar33;
  double *pdVar34;
  ulong uVar35;
  double *pdVar36;
  int *piVar37;
  Long LVar38;
  int *piVar39;
  Long LVar40;
  uint uVar41;
  uint uVar42;
  int iVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  int iVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  ulong uVar59;
  long lVar60;
  long lVar61;
  long lVar62;
  long lVar63;
  double *pdVar64;
  uint uVar65;
  long lVar66;
  long lVar67;
  int iVar68;
  long lVar69;
  uint uVar70;
  long lVar71;
  long lVar72;
  int iVar73;
  long lVar74;
  long lVar75;
  long lVar76;
  long lVar77;
  undefined4 in_register_0000008c;
  long lVar78;
  long lVar79;
  int iVar80;
  long lVar81;
  long lVar82;
  long lVar83;
  int iVar84;
  long lVar85;
  int iVar86;
  long lVar87;
  long lVar88;
  long lVar89;
  long lVar90;
  int iVar91;
  long lVar92;
  long lVar93;
  long lVar94;
  uint uVar95;
  int iVar96;
  long lVar97;
  long lVar98;
  long lVar99;
  long lVar100;
  size_t sVar101;
  long lVar102;
  long lVar103;
  long lVar104;
  long lVar105;
  long lVar106;
  long lVar107;
  bool bVar108;
  bool bVar109;
  undefined4 uVar110;
  undefined4 uVar111;
  double dVar112;
  undefined1 auVar113 [16];
  double dVar114;
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  double dVar122;
  double dVar123;
  double dVar124;
  double dVar125;
  double dVar126;
  double dVar127;
  double dVar128;
  double *pdVar129;
  double dVar130;
  double dVar131;
  double *pdVar132;
  double dVar133;
  MFIter mfi;
  Array1D<double,_0,_31> u_ls;
  Array1D<double,_0,_31> a_ls;
  Array1D<double,_0,_31> r_ls;
  Array1D<double,_0,_31> c_ls;
  Array1D<double,_0,_31> b_ls;
  double local_1010;
  double *local_1008;
  double *local_1000;
  double local_ff8;
  double *local_fe8;
  int *local_fd8;
  double *local_fd0;
  int *local_fc8;
  long local_fc0;
  double *local_fb8;
  double *local_fb0;
  long local_fa0;
  long local_f98;
  double *local_f90;
  long local_f80;
  long local_f78;
  long local_f60;
  int *local_f58;
  ulong local_f48;
  ulong local_f30;
  long local_ed0;
  long local_ea0;
  int *local_e38;
  ulong local_e28;
  long local_e08;
  ulong local_de0;
  ulong local_d88;
  Array4<double> local_d30;
  ulong local_cf0;
  long local_ce8;
  ulong local_ce0;
  undefined8 local_cd8;
  double *local_cd0;
  ulong local_cc8;
  long local_cc0;
  double *local_cb8;
  size_t local_cb0;
  long local_ca8;
  long local_ca0;
  long local_c98;
  double *local_c90;
  long local_c88;
  double *local_c80;
  double *local_c78;
  long local_c70;
  double *local_c68;
  double *local_c60;
  Real local_c58;
  Array4<const_int> local_c50;
  Array4<const_int> local_c10;
  Array4<const_int> local_bd0;
  Box local_b90;
  Box local_b74;
  Array4<const_double> local_b58;
  MLABecLaplacian *local_b18;
  Array4<const_double> local_b10;
  Array4<const_double> local_ad0;
  Array4<const_double> local_a90;
  Array4<const_double> local_a50;
  Array4<const_double> local_a10;
  Array4<const_double> local_9d0;
  Array4<const_double> local_990;
  Array4<const_double> local_950;
  Array4<const_double> local_910;
  FabArray<amrex::FArrayBox> *local_8d0;
  long local_8c8;
  long local_8c0;
  ulong local_8b8;
  ulong local_8b0;
  long local_8a8;
  size_t local_8a0;
  long local_898;
  int local_890;
  uint local_88c;
  int local_888;
  int local_884;
  Array4<const_double> local_880;
  Array4<const_int> local_840;
  Array4<const_int> local_800;
  Array4<const_int> local_7c0;
  FabArray<amrex::FArrayBox> *local_780;
  FabArray<amrex::FArrayBox> *local_778;
  ulong local_770;
  FabArray<amrex::Mask> *local_768;
  FabArray<amrex::Mask> *local_760;
  FabArray<amrex::Mask> *local_758;
  FabArray<amrex::FArrayBox> *local_750;
  FabArray<amrex::FArrayBox> *local_748;
  FabArray<amrex::FArrayBox> *local_740;
  FabArray<amrex::FArrayBox> *local_738;
  FabArray<amrex::FArrayBox> *local_730;
  FabArray<amrex::FArrayBox> *local_728;
  FabArray<amrex::Mask> *local_720;
  FabArray<amrex::FArrayBox> *local_718;
  FabArray<amrex::Mask> *local_710;
  FabArray<amrex::FArrayBox> *local_708;
  FabArray<amrex::Mask> *local_700;
  long local_6f8;
  FabArray<amrex::FArrayBox> *local_6f0;
  double local_6e8;
  double dStack_6e0;
  double local_6d8;
  undefined8 uStack_6d0;
  double local_6c8;
  double dStack_6c0;
  undefined1 local_6b8 [16];
  MFIter local_6a8;
  double local_648 [32];
  Array4<const_int> local_548 [4];
  double *local_448;
  double adStack_440 [31];
  MFItInfo local_344;
  double adStack_330 [32];
  double *local_230;
  double adStack_228 [32];
  double adStack_128 [31];
  
  local_cd8 = CONCAT44(in_register_0000008c,redblack);
  bVar108 = true;
  if (0 < mglev && amrlev == 0) {
    pIVar5 = (this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.mg_coarsen_ratio_vec.
             super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_start;
    bVar108 = false;
    if ((pIVar5[(ulong)(uint)mglev - 1].vect[0] == 2) &&
       (pIVar5[(ulong)(uint)mglev - 1].vect[1] == 2)) {
      bVar108 = pIVar5[(ulong)(uint)mglev - 1].vect[2] == 2;
    }
  }
  lVar97 = (long)amrlev;
  local_6f8 = lVar97 * 3;
  lVar66 = (long)mglev;
  local_8d0 = *(FabArray<amrex::FArrayBox> **)
               &(this->m_a_coeffs).
                super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                .
                super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar97].
                super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>;
  local_b18 = this;
  local_8c8 = lVar66;
  local_778 = &sol->super_FabArray<amrex::FArrayBox>;
  local_6f0 = &rhs->super_FabArray<amrex::FArrayBox>;
  if ((*(long *)local_8d0[lVar66].super_FabArrayBase.n_grow.vect != 0) ||
     (local_8d0[lVar66].super_FabArrayBase.n_grow.vect[2] != 0)) {
    Assert_host("acoef.nGrowVect() == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLABecLaplacian.cpp"
                ,0x294,(char *)0x0);
  }
  lVar102 = local_8c8;
  pMVar23 = local_b18;
  local_780 = (FabArray<amrex::FArrayBox> *)
              (local_8c8 * 0x480 +
              *(long *)&(local_b18->m_b_coeffs).
                        super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                        .
                        super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar97].
                        super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                        .
                        super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
              );
  lVar57 = *(long *)&(local_b18->super_MLCellABecLap).super_MLCellLinOp.m_undrrelxr.
                     super_vector<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>,_std::allocator<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>,_std::allocator<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar97].
                     super_vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>.
                     super__Vector_base<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>
  ;
  lVar58 = *(long *)&(local_b18->super_MLCellABecLap).super_MLCellLinOp.m_maskvals.
                     super_vector<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar97].
                     super_vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>
                     .
                     super__Vector_base<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>
  ;
  uVar41 = (*(local_b18->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp[5])();
  lVar97 = *(long *)&(pMVar23->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_geom.
                     super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar97].
                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  lVar53 = lVar102 * 200;
  dVar114 = pMVar23->m_b_scalar;
  pdVar64 = (double *)(lVar97 + 0x20 + lVar53);
  dVar112 = *pdVar64;
  dVar122 = pdVar64[1];
  dVar119 = *(double *)(lVar97 + 0x30 + lVar53);
  local_c58 = pMVar23->m_a_scalar;
  local_344.num_streams = Gpu::Device::max_gpu_streams;
  local_344.do_tiling = true;
  local_344.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
  local_344.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
  local_344.tilesize.vect[2] = DAT_00717ec0;
  local_344.dynamic = true;
  local_344.device_sync = true;
  MFIter::MFIter(&local_6a8,&local_778->super_FabArrayBase,&local_344);
  if (local_6a8.currentIndex < local_6a8.endIndex) {
    local_8d0 = local_8d0 + lVar66;
    local_708 = local_780 + 1;
    local_718 = local_780 + 2;
    lVar102 = lVar102 * 0x900;
    local_720 = (FabArray<amrex::Mask> *)(lVar58 + lVar102);
    lVar66 = local_8c8 * 0x970;
    local_728 = (FabArray<amrex::FArrayBox> *)(lVar66 + lVar57 + 8);
    local_730 = (FabArray<amrex::FArrayBox> *)(lVar57 + 0x188 + lVar66);
    local_738 = (FabArray<amrex::FArrayBox> *)(lVar57 + 0x308 + lVar66);
    local_740 = (FabArray<amrex::FArrayBox> *)(lVar57 + 0x488 + lVar66);
    local_748 = (FabArray<amrex::FArrayBox> *)(lVar57 + 0x608 + lVar66);
    local_750 = (FabArray<amrex::FArrayBox> *)(lVar66 + lVar57 + 0x788);
    local_700 = local_720 + 1;
    local_710 = local_720 + 2;
    local_758 = (FabArray<amrex::Mask> *)(lVar58 + lVar102 + 0x480);
    local_760 = (FabArray<amrex::Mask> *)(lVar58 + 0x600 + lVar102);
    local_768 = (FabArray<amrex::Mask> *)(lVar58 + 0x780 + lVar102);
    dVar122 = dVar122 * dVar122;
    auVar120._8_8_ = dVar114;
    auVar120._0_8_ = dVar114;
    auVar121._8_4_ = SUB84(dVar122,0);
    auVar121._0_8_ = dVar112 * dVar112;
    auVar121._12_4_ = (int)((ulong)dVar122 >> 0x20);
    auVar121 = divpd(auVar120,auVar121);
    dVar114 = dVar114 / (dVar119 * dVar119);
    dVar122 = auVar121._8_8_;
    dVar119 = auVar121._0_8_;
    auVar113._8_8_ = 0;
    auVar113._0_8_ = -(ulong)(dVar122 < dVar119);
    auVar6._8_4_ = (int)-(ulong)(dVar122 < 0.0);
    auVar6._0_8_ = -(ulong)(dVar122 < dVar114);
    auVar6._12_4_ = (int)(-(ulong)(dVar122 < 0.0) >> 0x20);
    local_770 = SUB168(auVar113 | auVar6,0);
    local_890 = 1 - SUB164(auVar113 | auVar6,0);
    local_88c = -(uint)(dVar119 < dVar114 || dVar119 < dVar122);
    if ((local_88c & 1) == 0) {
      local_890 = 0;
    }
    local_6c8 = -dVar122;
    dStack_6c0 = -dVar122;
    local_6d8 = -dVar114;
    uStack_6d0 = 0x8000000000000000;
    local_6b8._8_4_ = auVar121._8_4_;
    local_6b8._0_8_ = -dVar119;
    local_6b8._12_4_ = auVar121._12_4_ ^ 0x80000000;
    local_ce0 = (ulong)uVar41;
    local_6e8 = dVar114;
    dStack_6e0 = dVar114;
    do {
      FabArray<amrex::Mask>::array<amrex::Mask,_0>(&local_bd0,local_720,&local_6a8);
      FabArray<amrex::Mask>::array<amrex::Mask,_0>(&local_c10,local_700,&local_6a8);
      FabArray<amrex::Mask>::array<amrex::Mask,_0>(&local_c50,local_710,&local_6a8);
      FabArray<amrex::Mask>::array<amrex::Mask,_0>(&local_7c0,local_758,&local_6a8);
      FabArray<amrex::Mask>::array<amrex::Mask,_0>(&local_800,local_760,&local_6a8);
      FabArray<amrex::Mask>::array<amrex::Mask,_0>(&local_840,local_768,&local_6a8);
      MFIter::tilebox(&local_b74,&local_6a8);
      BATransformer::operator()
                (&local_b90,&((local_6a8.fabArray)->boxarray).m_bat,
                 (Box *)((long)((local_6a8.index_map)->super_vector<int,_std::allocator<int>_>).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[local_6a8.currentIndex] * 0x1c +
                        *(long *)&((((local_6a8.fabArray)->boxarray).m_ref.
                                    super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->m_abox).
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data));
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_d30,local_778,&local_6a8);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_910,local_6f0,&local_6a8);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_880,local_8d0,&local_6a8);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_950,local_780,&local_6a8);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_b58,local_708,&local_6a8);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_990,local_718,&local_6a8);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_9d0,local_728,&local_6a8);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_a10,local_730,&local_6a8);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_a50,local_738,&local_6a8);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_a90,local_740,&local_6a8);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_ad0,local_748,&local_6a8);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_b10,local_750,&local_6a8);
      iVar20 = local_b74.bigend.vect[2];
      iVar73 = local_b74.bigend.vect[1];
      iVar19 = local_b74.bigend.vect[0];
      iVar18 = local_b74.smallend.vect[2];
      iVar17 = local_b74.smallend.vect[1];
      iVar16 = local_b74.smallend.vect[0];
      iVar86 = local_b90.bigend.vect[2];
      iVar15 = local_b90.bigend.vect[1];
      iVar14 = local_b90.bigend.vect[0];
      iVar13 = local_b90.smallend.vect[2];
      iVar12 = local_b90.smallend.vect[1];
      iVar91 = local_b90.smallend.vect[0];
      this_00._M_t.
      super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
      super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
           *(tuple<amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_> *)
            &(&(((local_b18->super_MLCellABecLap).m_overset_mask.
                 super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                 .
                 super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
               ).
               super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)[local_6f8][local_8c8]._M_t;
      if ((__uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>)
          this_00._M_t.
          super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
          super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl ==
          (__uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>)0x0) {
        if (bVar108) {
          if (0 < (int)uVar41) {
            local_de0 = 0;
            do {
              iVar91 = local_b74.smallend.vect[2];
              if (local_b74.smallend.vect[2] <= local_b74.bigend.vect[2]) {
                do {
                  if (local_b74.smallend.vect[1] <= local_b74.bigend.vect[1]) {
                    uVar42 = local_b74.smallend.vect[1];
                    do {
                      if (local_b74.smallend.vect[0] <= local_b74.bigend.vect[0]) {
                        lVar55 = (long)(int)uVar42;
                        lVar53 = (long)iVar91;
                        local_1008 = local_880.p +
                                     (lVar55 - local_880.begin.y) * local_880.jstride +
                                     (lVar53 - local_880.begin.z) * local_880.kstride;
                        lVar57 = (lVar55 - local_950.begin.y) * local_950.jstride;
                        lVar102 = (lVar53 - local_950.begin.z) * local_950.kstride;
                        lVar58 = (lVar53 - local_b58.begin.z) * local_b58.kstride;
                        local_1000 = local_b58.p +
                                     (int)((uVar42 + 1) - local_b58.begin.y) * local_b58.jstride +
                                     lVar58 + local_b58.nstride * local_de0;
                        lVar97 = (int)(uVar42 - local_d30.begin.y) * local_d30.jstride;
                        lVar54 = (iVar91 - local_d30.begin.z) * local_d30.kstride;
                        local_fe8 = local_990.p + (lVar55 - local_990.begin.y) * local_990.jstride;
                        lVar56 = local_d30.nstride * local_de0;
                        lVar66 = (long)local_b74.smallend.vect[0];
                        do {
                          if (((int)local_cd8 + iVar91 + uVar42 + (int)lVar66 & 1) == 0) {
                            dVar112 = 0.0;
                            uVar110 = 0;
                            uVar111 = 0;
                            if ((lVar66 == local_b90.smallend.vect[0]) &&
                               (0 < local_bd0.p
                                    [(lVar55 - local_bd0.begin.y) * local_bd0.jstride +
                                     (long)(~local_bd0.begin.x + local_b90.smallend.vect[0]) +
                                     (lVar53 - local_bd0.begin.z) * local_bd0.kstride])) {
                              uVar110 = SUB84(local_9d0.p
                                              [(lVar55 - local_9d0.begin.y) * local_9d0.jstride +
                                               ((long)local_b90.smallend.vect[0] -
                                               (long)local_9d0.begin.x) +
                                               (lVar53 - local_9d0.begin.z) * local_9d0.kstride +
                                               local_9d0.nstride * local_de0],0);
                              uVar111 = (undefined4)
                                        ((ulong)local_9d0.p
                                                [(lVar55 - local_9d0.begin.y) * local_9d0.jstride +
                                                 ((long)local_b90.smallend.vect[0] -
                                                 (long)local_9d0.begin.x) +
                                                 (lVar53 - local_9d0.begin.z) * local_9d0.kstride +
                                                 local_9d0.nstride * local_de0] >> 0x20);
                            }
                            if ((local_b90.smallend.vect[1] == uVar42) &&
                               (0 < local_c10.p
                                    [(~local_c10.begin.y + local_b90.smallend.vect[1]) *
                                     local_c10.jstride +
                                     (lVar53 - local_c10.begin.z) * local_c10.kstride +
                                     (lVar66 - local_c10.begin.x)])) {
                              dVar112 = local_a10.p
                                        [((long)local_b90.smallend.vect[1] - (long)local_a10.begin.y
                                         ) * local_a10.jstride +
                                         (lVar53 - local_a10.begin.z) * local_a10.kstride +
                                         local_a10.nstride * local_de0 +
                                         (lVar66 - local_a10.begin.x)];
                            }
                            dVar123 = 0.0;
                            dVar115 = 0.0;
                            if ((local_b90.smallend.vect[2] == iVar91) &&
                               (0 < local_c50.p
                                    [(lVar55 - local_c50.begin.y) * local_c50.jstride +
                                     (~local_c50.begin.z + local_b90.smallend.vect[2]) *
                                     local_c50.kstride + (lVar66 - local_c50.begin.x)])) {
                              dVar115 = local_a50.p
                                        [(lVar55 - local_a50.begin.y) * local_a50.jstride +
                                         ((long)local_b90.smallend.vect[2] - (long)local_a50.begin.z
                                         ) * local_a50.kstride +
                                         local_a50.nstride * local_de0 +
                                         (lVar66 - local_a50.begin.x)];
                            }
                            if ((lVar66 == local_b90.bigend.vect[0]) &&
                               (0 < local_7c0.p
                                    [(lVar55 - local_7c0.begin.y) * local_7c0.jstride +
                                     (long)((local_b90.bigend.vect[0] - local_7c0.begin.x) + 1) +
                                     (lVar53 - local_7c0.begin.z) * local_7c0.kstride])) {
                              dVar123 = local_a90.p
                                        [(lVar55 - local_a90.begin.y) * local_a90.jstride +
                                         ((long)local_b90.bigend.vect[0] - (long)local_a90.begin.x)
                                         + (lVar53 - local_a90.begin.z) * local_a90.kstride +
                                           local_a90.nstride * local_de0];
                            }
                            dVar126 = 0.0;
                            dVar127 = 0.0;
                            if ((local_b90.bigend.vect[1] == uVar42) &&
                               (0 < local_800.p
                                    [((local_b90.bigend.vect[1] - local_800.begin.y) + 1) *
                                     local_800.jstride +
                                     (lVar53 - local_800.begin.z) * local_800.kstride +
                                     (lVar66 - local_800.begin.x)])) {
                              dVar127 = local_ad0.p
                                        [((long)local_b90.bigend.vect[1] - (long)local_ad0.begin.y)
                                         * local_ad0.jstride +
                                         (lVar53 - local_ad0.begin.z) * local_ad0.kstride +
                                         local_ad0.nstride * local_de0 +
                                         (lVar66 - local_ad0.begin.x)];
                            }
                            if ((local_b90.bigend.vect[2] == iVar91) &&
                               (0 < local_840.p
                                    [(lVar55 - local_840.begin.y) * local_840.jstride +
                                     ((local_b90.bigend.vect[2] - local_840.begin.z) + 1) *
                                     local_840.kstride + (lVar66 - local_840.begin.x)])) {
                              dVar126 = local_b10.p
                                        [(lVar55 - local_b10.begin.y) * local_b10.jstride +
                                         ((long)local_b90.bigend.vect[2] - (long)local_b10.begin.z)
                                         * local_b10.kstride +
                                         local_b10.nstride * local_de0 +
                                         (lVar66 - local_b10.begin.x)];
                            }
                            dVar2 = local_950.p
                                    [lVar57 + lVar102 + local_950.nstride * local_de0 +
                                                        (lVar66 - local_950.begin.x)];
                            dVar3 = local_950.p
                                    [lVar57 + lVar102 + local_950.nstride * local_de0 +
                                                        ((lVar66 + 1) - (long)local_950.begin.x)];
                            dVar116 = local_b58.p
                                      [(int)(uVar42 - local_b58.begin.y) * local_b58.jstride +
                                       lVar58 + local_b58.nstride * local_de0 +
                                                (lVar66 - local_b58.begin.x)];
                            dVar124 = local_1000[lVar66 - local_b58.begin.x];
                            dVar133 = local_fe8[(lVar66 - local_990.begin.x) +
                                                (iVar91 - local_990.begin.z) * local_990.kstride +
                                                local_990.nstride * local_de0];
                            dVar125 = local_fe8[(lVar66 - local_990.begin.x) +
                                                ((iVar91 + 1) - local_990.begin.z) *
                                                local_990.kstride + local_990.nstride * local_de0];
                            dVar118 = (dVar133 + dVar125) * dStack_6e0 +
                                      (dVar116 + dVar124) * dVar122 +
                                      local_1008[lVar66 - local_880.begin.x] * local_c58 +
                                      (dVar2 + dVar3) * dVar119;
                            lVar67 = lVar66 - local_d30.begin.x;
                            local_d30.p[lVar97 + lVar67 + lVar54 + lVar56] =
                                 (1.15 / (dVar118 -
                                         ((dVar115 * dVar133 + dVar126 * dVar125) * local_6e8 +
                                         ((double)CONCAT44(uVar111,uVar110) * dVar2 +
                                         dVar123 * dVar3) * dVar119 +
                                         (dVar112 * dVar116 + dVar127 * dVar124) * dVar122))) *
                                 (local_910.p
                                  [(lVar55 - local_910.begin.y) * local_910.jstride +
                                   (lVar53 - local_910.begin.z) * local_910.kstride +
                                   local_910.nstride * local_de0 + (lVar66 - local_910.begin.x)] -
                                 (dVar118 * local_d30.p[lVar97 + lVar67 + lVar54 + lVar56] -
                                 ((dVar133 * local_d30.p
                                             [lVar97 + lVar67 + (~local_d30.begin.z + iVar91) *
                                                                local_d30.kstride + lVar56] +
                                  dVar125 * local_d30.p
                                            [lVar97 + lVar67 + ((iVar91 + 1) - local_d30.begin.z) *
                                                               local_d30.kstride + lVar56]) *
                                  dVar114 +
                                 (dVar2 * local_d30.p
                                          [lVar97 + lVar54 + lVar56 + ((int)lVar66 +
                                                                      ~local_d30.begin.x)] +
                                 dVar3 * local_d30.p
                                         [lVar97 + lVar54 + lVar56 + ((lVar66 + 1) -
                                                                     (long)local_d30.begin.x)]) *
                                 dVar119 + (dVar116 * local_d30.p
                                                      [(int)(~local_d30.begin.y + uVar42) *
                                                       local_d30.jstride + lVar54 + lVar56 + lVar67]
                                           + dVar124 * local_d30.p
                                                       [(int)((uVar42 + 1) - local_d30.begin.y) *
                                                        local_d30.jstride + lVar54 + lVar56 + lVar67
                                                       ]) * dVar122))) +
                                 local_d30.p[lVar97 + lVar67 + lVar54 + lVar56];
                          }
                          lVar66 = lVar66 + 1;
                        } while (local_b74.bigend.vect[0] + 1 != (int)lVar66);
                      }
                      uVar42 = uVar42 + 1;
                    } while (uVar42 != local_b74.bigend.vect[1] + 1U);
                  }
                  iVar91 = iVar91 + 1;
                } while (iVar91 != local_b74.bigend.vect[2] + 1);
              }
              local_de0 = local_de0 + 1;
            } while (local_de0 != local_ce0);
          }
        }
        else {
          lVar97 = (long)local_b74.bigend.vect[0];
          lVar66 = (long)local_b74.bigend.vect[1];
          lVar54 = (long)local_b74.bigend.vect[2];
          lVar57 = (long)local_b90.smallend.vect[0];
          lVar58 = (long)local_b90.smallend.vect[1];
          lVar102 = (long)local_b90.smallend.vect[2];
          lVar53 = (long)local_b90.bigend.vect[0];
          uVar70 = local_b74.bigend.vect[2] - local_b74.smallend.vect[2];
          uVar65 = local_b74.bigend.vect[1] - local_b74.smallend.vect[1];
          uVar42 = uVar65;
          if ((local_770 & 1) != 0) {
            uVar42 = uVar70;
          }
          lVar55 = (long)local_b90.bigend.vect[1];
          uVar95 = local_b74.bigend.vect[0] - local_b74.smallend.vect[0];
          if ((local_88c & 1) == 0) {
            uVar42 = uVar95;
          }
          uVar59 = (ulong)uVar42;
          lVar56 = (long)local_b90.bigend.vect[2];
          if (0x1f < (int)uVar42) {
            Abort_host("abec_gsrb_with_line_solve is hard-wired to be no longer than 32");
          }
          local_898 = lVar66;
          if (local_890 == 2) {
            if (0 < (int)uVar41) {
              lVar66 = (long)iVar18;
              local_c98 = CONCAT44(local_c98._4_4_,iVar14 + 1);
              local_ca0 = CONCAT44(local_ca0._4_4_,iVar15 + 1);
              local_ca8 = CONCAT44(local_ca8._4_4_,iVar86 + 1);
              local_cb0 = (ulong)uVar70 * 8 + 8;
              local_cb8 = (double *)(lVar53 * 8);
              iVar86 = (iVar20 - iVar18) + 1;
              local_cc0 = lVar57 * 8;
              local_cd0 = (double *)(uVar59 + 1);
              local_e08 = 0;
              local_d88 = 0;
              local_cc8 = uVar59;
              do {
                uVar65 = iVar17;
                if (iVar17 <= (int)local_898) {
                  do {
                    if (iVar16 <= iVar19) {
                      local_c68 = (double *)(ulong)((int)local_cd8 + uVar65);
                      iVar96 = iVar16 + -1;
                      iVar68 = iVar16;
                      iVar80 = iVar16;
                      do {
                        LVar38 = local_800.kstride;
                        piVar37 = local_840.p;
                        LVar33 = local_990.kstride;
                        pdVar26 = local_990.p;
                        LVar31 = local_9d0.kstride;
                        local_fb8 = local_9d0.p;
                        pdVar25 = local_a50.p;
                        LVar27 = local_a90.kstride;
                        pdVar24 = local_b10.p;
                        LVar22 = local_b58.kstride;
                        LVar21 = local_b58.jstride;
                        pdVar129 = local_b58.p;
                        LVar11 = local_bd0.kstride;
                        piVar10 = local_bd0.p;
                        LVar8 = local_c10.kstride;
                        piVar9 = local_c10.p;
                        piVar7 = local_c50.p;
                        lVar97 = local_cc0;
                        pdVar64 = local_d30.p;
                        iVar80 = iVar80 + 1;
                        if (((int)local_c68 + iVar68 & 1U) == 0) {
                          lVar58 = (long)iVar68;
                          lVar57 = lVar58 * 8;
                          if (iVar18 <= iVar20) {
                            iVar84 = uVar65 - local_b58.begin.y;
                            iVar43 = (uVar65 + 1) - local_b58.begin.y;
                            lVar83 = (long)local_c50.begin.x;
                            lVar69 = (long)(int)uVar65;
                            lVar94 = (lVar69 - local_c50.begin.y) * local_c50.jstride;
                            lVar85 = (long)local_a50.begin.x;
                            lVar103 = (lVar69 - local_a50.begin.y) * local_a50.jstride;
                            lVar99 = (lVar102 - local_a50.begin.z) * local_a50.kstride;
                            lVar89 = (long)local_840.begin.x;
                            lVar100 = (lVar69 - local_840.begin.y) * local_840.jstride;
                            lVar104 = local_950.kstride * 8;
                            lVar74 = local_ad0.kstride * 8;
                            lVar75 = local_a10.kstride * 8;
                            lVar76 = local_7c0.kstride * 4;
                            lVar53 = lVar58 * 4;
                            lVar77 = local_880.kstride * 8;
                            uVar70 = ~local_bd0.begin.x;
                            lVar51 = (~local_c50.begin.z + iVar13) * local_c50.kstride;
                            lVar60 = ((int)local_ca8 - local_840.begin.z) * local_840.kstride;
                            lVar61 = local_950.nstride * local_e08 +
                                     (lVar66 - local_950.begin.z) * lVar104 +
                                     (int)(uVar65 - local_950.begin.y) * local_950.jstride * 8 +
                                     (long)local_950.begin.x * -8 + (long)local_950.p;
                            lVar79 = (int)(uVar65 - local_990.begin.y) * local_990.jstride;
                            local_f60 = local_ad0.nstride * local_e08 +
                                        (lVar66 - local_ad0.begin.z) * lVar74 +
                                        (iVar15 - local_ad0.begin.y) * local_ad0.jstride * 8 +
                                        (long)local_ad0.begin.x * -8 + (long)local_ad0.p;
                            lVar55 = (int)(uVar65 - local_a90.begin.y) * local_a90.jstride;
                            lVar62 = local_a50.nstride * local_d88;
                            local_f78 = local_a10.nstride * local_e08 +
                                        (lVar66 - local_a10.begin.z) * lVar75 +
                                        (iVar12 - local_a10.begin.y) * local_a10.jstride * 8 +
                                        (long)local_a10.begin.x * -8 + (long)local_a10.p;
                            lVar67 = local_b58.nstride * local_e08;
                            lVar98 = (int)(uVar65 - local_9d0.begin.y) * local_9d0.jstride;
                            lVar78 = local_990.nstride * local_e08;
                            lVar90 = (int)(uVar65 - local_bd0.begin.y) * local_bd0.jstride;
                            lVar81 = (long)local_a90.p + (long)local_cb8;
                            lVar82 = (~local_c10.begin.y + iVar12) * local_c10.jstride;
                            local_ce8 = local_a90.nstride * local_e08;
                            local_1008 = (double *)
                                         ((lVar66 - local_7c0.begin.z) * lVar76 +
                                          (int)(uVar65 - local_7c0.begin.y) * local_7c0.jstride * 4
                                          + (long)((int)local_c98 - local_7c0.begin.x) * 4 +
                                         (long)local_7c0.p);
                            local_e38 = (int *)((lVar66 - local_800.begin.z) * local_800.kstride * 4
                                                + ((int)local_ca0 - local_800.begin.y) *
                                                  local_800.jstride * 4 + lVar53 +
                                                (long)local_800.begin.x * -4 + (long)local_800.p);
                            lVar87 = local_9d0.nstride * local_e08;
                            lVar63 = (lVar66 - local_880.begin.z) * lVar77 +
                                     (int)(uVar65 - local_880.begin.y) * local_880.jstride * 8 +
                                     (long)local_880.begin.x * -8 + (long)local_880.p;
                            lVar88 = (long)local_b58.begin.x;
                            lVar92 = (long)local_b58.begin.z;
                            lVar44 = (long)local_990.begin.x;
                            lVar45 = (long)local_990.begin.z;
                            lVar46 = (long)local_bd0.begin.z;
                            local_cf0 = (ulong)local_9d0.begin.x;
                            lVar47 = (long)local_9d0.begin.z;
                            lVar48 = (long)local_c10.begin.x;
                            lVar49 = (long)local_c10.begin.z;
                            lVar50 = (long)local_a90.begin.x;
                            local_c70 = (long)local_a90.begin.z;
                            local_c80 = local_d30.p;
                            local_c78 = local_910.p;
                            memset(local_648,0,local_cb0);
                            local_c88 = (long)local_d30.begin.x;
                            local_c60 = pdVar64 + local_d30.jstride *
                                                  (int)(uVar65 - local_d30.begin.y) +
                                                  (long)(iVar68 - local_d30.begin.x) +
                                                  (~local_d30.begin.z + iVar18) * local_d30.kstride;
                            lVar105 = LVar22 * 8;
                            lVar67 = (lVar66 - lVar92) * lVar105 + lVar67;
                            lVar93 = (long)iVar43 * LVar21 * 8 + lVar67 + lVar88 * -8 +
                                     (long)pdVar129;
                            lVar88 = LVar21 * 8 * (long)iVar84 + lVar67 + lVar88 * -8 +
                                     (long)pdVar129;
                            lVar92 = local_d30.kstride * 8;
                            local_c90 = (double *)((lVar66 - local_d30.begin.z) * lVar92);
                            lVar71 = local_d30.jstride * 8;
                            lVar67 = local_d30.nstride * local_e08;
                            lVar72 = lVar71 * (int)(uVar65 - local_d30.begin.y);
                            local_1000 = (double *)
                                         (local_910.nstride * local_e08 +
                                          (lVar66 - local_910.begin.z) * local_910.kstride * 8 +
                                          (int)(uVar65 - local_910.begin.y) * local_910.jstride * 8
                                          + (long)local_910.begin.x * -8 + (long)local_c78);
                            local_fb0 = (double *)
                                        ((lVar66 - local_c70) * LVar27 * 8 + lVar55 * 8 + local_ce8
                                         + lVar50 * -8 + lVar81);
                            local_fb8 = (double *)
                                        ((long)local_fb8 +
                                        (lVar66 - lVar47) * LVar31 * 8 + lVar98 * 8 + lVar87 +
                                        local_cf0 * -8 + lVar97);
                            local_fc8 = (int *)((lVar66 - lVar46) * LVar11 * 4 + lVar90 * 4 +
                                                (long)(int)(uVar70 + iVar91) * 4 + (long)piVar10);
                            local_fd0 = (double *)
                                        ((lVar66 - local_bd0.begin.z) * local_bd0.kstride * 4 +
                                         (int)(uVar65 - local_bd0.begin.y) * local_bd0.jstride * 4 +
                                         (long)(~local_bd0.begin.x + iVar91) * 4 + (long)piVar10);
                            local_fd8 = (int *)((lVar66 - lVar49) * LVar8 * 4 + lVar82 * 4 + lVar53
                                                + lVar48 * -4 + (long)piVar9);
                            local_f90 = (double *)
                                        ((lVar66 - local_c10.begin.z) * local_c10.kstride * 4 +
                                         (~local_c10.begin.y + iVar12) * local_c10.jstride * 4 +
                                         lVar53 + (long)local_c10.begin.x * -4 + (long)piVar9);
                            lVar81 = (long)local_c90 +
                                     local_c88 * -8 +
                                     (int)((uVar65 + 1) - local_d30.begin.y) * lVar71 + lVar67 +
                                     (long)local_c80;
                            lVar53 = (long)local_c90 +
                                     local_c88 * -8 +
                                     (int)(~local_d30.begin.y + uVar65) * lVar71 + lVar67 +
                                     (long)local_c80;
                            lVar55 = (long)local_c90 + local_c88 * -8 + lVar72 + (long)local_c80;
                            lVar47 = (long)local_c90 +
                                     (long)(iVar96 - local_d30.begin.x) * 8 + lVar72 +
                                     (long)local_c80;
                            lVar97 = ((lVar66 + 1) - (long)local_d30.begin.z) * lVar92 +
                                     local_c88 * -8 + (long)local_c80;
                            lVar87 = LVar33 * 8;
                            lVar46 = (lVar66 - lVar45) * lVar87 + lVar79 * 8 + lVar78 + lVar44 * -8
                                     + (long)pdVar26;
                            lVar44 = ((lVar66 + 1) - lVar45) * lVar87 + lVar79 * 8 + lVar78 +
                                     lVar44 * -8 + (long)pdVar26;
                            lVar78 = 0;
                            do {
                              dVar112 = *(double *)(lVar61 + lVar57);
                              dVar115 = *(double *)(lVar61 + (long)iVar80 * 8);
                              dVar123 = *(double *)(lVar63 + lVar57);
                              dVar127 = *(double *)(lVar88 + lVar57);
                              dVar126 = *(double *)(lVar93 + lVar57);
                              dVar2 = *(double *)(lVar46 + lVar57);
                              dVar3 = *(double *)(lVar44 + lVar57);
                              dVar124 = 0.0;
                              dVar116 = 0.0;
                              if ((iVar68 == iVar91) && (0 < *local_fc8)) {
                                dVar116 = *local_fb8;
                              }
                              if ((uVar65 == iVar12) && (0 < *local_fd8)) {
                                dVar124 = *(double *)(local_f78 + lVar57);
                              }
                              dVar125 = 0.0;
                              dVar133 = 0.0;
                              if ((lVar102 - lVar66 == lVar78) &&
                                 (0 < piVar7[lVar94 + (lVar58 - lVar83) + lVar51])) {
                                dVar133 = pdVar25[lVar103 + (lVar58 - lVar85) + lVar99 + lVar62];
                              }
                              if ((iVar68 == iVar14) && (0 < *(int *)local_1008)) {
                                dVar125 = *local_fb0;
                              }
                              dVar118 = 0.0;
                              uVar110 = 0;
                              uVar111 = 0;
                              if ((uVar65 == iVar15) && (0 < *local_e38)) {
                                uVar110 = (undefined4)*(undefined8 *)(local_f60 + lVar57);
                                uVar111 = (undefined4)
                                          ((ulong)*(undefined8 *)(local_f60 + lVar57) >> 0x20);
                              }
                              if ((lVar56 - lVar66 == lVar78) &&
                                 (0 < piVar37[lVar100 + (lVar58 - lVar89) + lVar60])) {
                                dVar118 = pdVar24[(lVar69 - local_b10.begin.y) * local_b10.jstride +
                                                  (lVar58 - local_b10.begin.x) +
                                                  (lVar56 - local_b10.begin.z) * local_b10.kstride +
                                                  local_b10.nstride * local_d88];
                              }
                              dVar117 = *(double *)(lVar55 + (long)iVar80 * 8 + lVar67);
                              dVar130 = (dVar112 * *(double *)(lVar47 + lVar67) + dVar115 * dVar117)
                                        * dVar119 +
                                        (dVar127 * *(double *)(lVar53 + lVar57) +
                                        dVar126 * *(double *)(lVar81 + lVar57)) * dVar122;
                              if ((iVar68 == iVar91) && (0 < *(int *)local_fd0)) {
                                dVar130 = dVar130 - dVar119 * dVar112 * *(double *)(lVar47 + lVar67)
                                ;
                              }
                              if ((iVar68 == iVar14) && (0 < *(int *)local_1008)) {
                                dVar130 = dVar130 - dVar119 * dVar115 * dVar117;
                              }
                              if ((uVar65 == iVar12) && (0 < *(int *)local_f90)) {
                                dVar130 = dVar130 - dVar122 * dVar127 * *(double *)(lVar53 + lVar57)
                                ;
                              }
                              if ((uVar65 == iVar15) && (0 < *local_e38)) {
                                dVar130 = dVar130 - dVar122 * dVar126 * *(double *)(lVar81 + lVar57)
                                ;
                              }
                              (&local_548[0].p)[lVar78] = (int *)(dVar2 * local_6d8);
                              adStack_228[lVar78 + -1] =
                                   ((dVar2 + dVar3) * dVar114 +
                                   (dVar127 + dVar126) * dVar122 +
                                   dVar123 * local_c58 + (dVar112 + dVar115) * dVar119) -
                                   ((dVar133 * dVar2 + dVar118 * dVar3) * dVar114 +
                                   (dVar112 * dVar116 + dVar115 * dVar125) * dVar119 +
                                   (dVar127 * dVar124 + dVar126 * (double)CONCAT44(uVar111,uVar110))
                                   * dVar122);
                              adStack_330[lVar78] = dVar3 * local_6d8;
                              pdVar64 = (double *)(dVar130 + *(double *)((long)local_1000 + lVar57))
                              ;
                              adStack_440[lVar78 + -1] = (double)pdVar64;
                              if ((lVar78 == 0) &&
                                 (local_548[0].p = (int *)0x0,
                                 piVar7[(lVar69 - local_c50.begin.y) * local_c50.jstride +
                                        (lVar58 - local_c50.begin.x) +
                                        (~local_c50.begin.z + iVar13) * local_c50.kstride] < 1)) {
                                pdVar64 = (double *)
                                          ((double)pdVar64 +
                                          dVar2 * dVar114 * local_c60[local_d30.nstride * local_d88]
                                          );
                                local_448 = pdVar64;
                              }
                              if ((lVar54 - lVar66 == lVar78) &&
                                 (adStack_330[lVar78] = 0.0,
                                 piVar37[lVar100 + (lVar58 - lVar89) + lVar60] < 1)) {
                                adStack_440[lVar78 + -1] =
                                     dVar3 * dVar114 *
                                     *(double *)(lVar97 + lVar72 + lVar57 + lVar67) +
                                     (double)pdVar64;
                              }
                              lVar78 = lVar78 + 1;
                              lVar61 = lVar61 + lVar104;
                              lVar93 = lVar93 + lVar105;
                              lVar88 = lVar88 + lVar105;
                              lVar46 = lVar46 + lVar87;
                              lVar81 = lVar81 + lVar92;
                              lVar53 = lVar53 + lVar92;
                              lVar55 = lVar55 + lVar92;
                              lVar47 = lVar47 + lVar92;
                              local_1000 = (double *)((long)local_1000 + local_910.kstride * 8);
                              local_f60 = local_f60 + lVar74;
                              local_fb0 = local_fb0 + LVar27;
                              local_f78 = local_f78 + lVar75;
                              local_fb8 = local_fb8 + LVar31;
                              local_fc8 = local_fc8 + LVar11;
                              local_fd8 = local_fd8 + LVar8;
                              local_1008 = (double *)((long)local_1008 + lVar76);
                              local_e38 = local_e38 + LVar38;
                              local_fd0 = (double *)((long)local_fd0 + local_bd0.kstride * 4);
                              local_f90 = (double *)((long)local_f90 + local_c10.kstride * 4);
                              lVar63 = lVar63 + lVar77;
                              lVar97 = lVar97 + lVar92;
                              lVar44 = lVar44 + lVar87;
                            } while (iVar86 != (int)lVar78);
                            local_1000 = local_230;
                            local_fe8 = local_448;
                          }
                          local_ff8 = (double)local_fe8 / (double)local_1000;
                          local_648[0] = local_ff8;
                          if (0 < (int)uVar42) {
                            lVar97 = 0;
                            local_1008 = local_1000;
                            do {
                              dVar115 = *(double *)((long)adStack_330 + lVar97) / (double)local_1008
                              ;
                              *(double *)((long)adStack_128 + lVar97) = dVar115;
                              dVar112 = *(double *)((long)&local_548[0].jstride + lVar97);
                              local_1008 = (double *)
                                           (*(double *)((long)adStack_228 + lVar97) -
                                           dVar115 * dVar112);
                              if (((double)local_1008 == 0.0) && (!NAN((double)local_1008))) {
                                Abort_host(">>>TRIDIAG FAILED");
                              }
                              local_ff8 = (local_ff8 * -dVar112 +
                                          *(double *)((long)adStack_440 + lVar97)) /
                                          (double)local_1008;
                              *(double *)((long)local_648 + lVar97 + 8) = local_ff8;
                              lVar97 = lVar97 + 8;
                            } while ((ulong)(uVar42 + 1) * 8 + -8 != lVar97);
                            if (0 < (int)uVar42) {
                              dVar112 = local_648[local_cc8];
                              pdVar64 = local_cd0;
                              do {
                                dVar112 = local_648[(long)pdVar64 + -2] -
                                          dVar112 * adStack_128[(long)pdVar64 + -2];
                                local_648[(long)pdVar64 + -2] = dVar112;
                                pdVar64 = (double *)((long)pdVar64 + -1);
                              } while (1 < (long)pdVar64);
                            }
                          }
                          if (iVar18 <= iVar20) {
                            pdVar64 = (double *)
                                      (local_d30.nstride * local_e08 + lVar57 +
                                       (lVar66 - local_d30.begin.z) * local_d30.kstride * 8 +
                                       ((long)(int)uVar65 - (long)local_d30.begin.y) *
                                       local_d30.jstride * 8 + (long)local_d30.begin.x * -8 +
                                      (long)local_d30.p);
                            lVar97 = 0;
                            do {
                              *pdVar64 = local_648[lVar97];
                              lVar97 = lVar97 + 1;
                              pdVar64 = pdVar64 + local_d30.kstride;
                            } while (iVar86 != (int)lVar97);
                          }
                        }
                        iVar96 = iVar96 + 1;
                        bVar109 = iVar68 != iVar19;
                        iVar68 = iVar68 + 1;
                      } while (bVar109);
                    }
                    uVar65 = uVar65 + 1;
                  } while (uVar65 != iVar73 + 1U);
                }
                local_d88 = local_d88 + 1;
                local_e08 = local_e08 + 8;
              } while (local_d88 != local_ce0);
            }
          }
          else if (local_890 == 1) {
            if (0 < (int)uVar41) {
              lVar54 = (long)iVar17;
              local_8a0 = (ulong)uVar65 * 8 + 8;
              iVar80 = iVar19 + 1;
              lVar102 = lVar66 - lVar54;
              local_884 = iVar18 + -1;
              local_8a8 = lVar53 * 8;
              iVar73 = (iVar73 - iVar17) + 1;
              local_8b0 = lVar57 * 8;
              lVar97 = lVar54 + 1;
              local_8c0 = uVar59 + 1;
              local_ea0 = 0;
              local_e28 = 0;
              local_8b8 = uVar59;
              local_888 = iVar80;
              do {
                iVar96 = iVar16;
                if (iVar16 <= iVar19) {
                  do {
                    if (iVar18 <= iVar20) {
                      uVar59 = (ulong)(uint)(iVar96 + (int)local_cd8);
                      lVar53 = (long)(iVar96 + 1) * 8;
                      lVar56 = (long)iVar96;
                      lVar57 = lVar56 * 8;
                      iVar84 = local_884;
                      local_cf0 = uVar59;
                      iVar43 = iVar18;
                      iVar68 = iVar18;
                      do {
                        LVar40 = local_7c0.jstride;
                        piVar39 = local_800.p;
                        LVar38 = local_840.jstride;
                        piVar37 = local_840.p;
                        lVar67 = local_8a8;
                        uVar35 = local_8b0;
                        pdVar26 = local_910.p;
                        LVar33 = local_990.kstride;
                        LVar31 = local_990.jstride;
                        pdVar25 = local_990.p;
                        LVar27 = local_9d0.jstride;
                        local_f90 = local_9d0.p;
                        LVar22 = local_a90.jstride;
                        local_fd0 = local_a90.p;
                        pdVar24 = local_b10.p;
                        LVar21 = local_b58.jstride;
                        pdVar129 = local_b58.p;
                        LVar11 = local_bd0.jstride;
                        piVar10 = local_bd0.p;
                        piVar9 = local_c10.p;
                        LVar8 = local_c50.jstride;
                        piVar7 = local_c50.p;
                        pdVar64 = local_d30.p;
                        iVar68 = iVar68 + 1;
                        lVar78 = (long)iVar43;
                        if ((iVar43 + (int)uVar59 & 1U) == 0) {
                          if (iVar17 <= (int)lVar66) {
                            lVar74 = (long)local_c10.begin.x;
                            lVar75 = (~local_c10.begin.y + iVar12) * local_c10.jstride;
                            local_c60 = local_a10.p +
                                        (lVar58 - local_a10.begin.y) * local_a10.jstride +
                                        (lVar56 - local_a10.begin.x) +
                                        (lVar78 - local_a10.begin.z) * local_a10.kstride;
                            lVar76 = (long)local_800.begin.x;
                            lVar77 = (int)((iVar15 + 1U) - local_800.begin.y) * local_800.jstride;
                            local_c68 = local_ad0.p +
                                        (lVar55 - local_ad0.begin.y) * local_ad0.jstride +
                                        (lVar56 - local_ad0.begin.x) +
                                        (lVar78 - local_ad0.begin.z) * local_ad0.kstride;
                            lVar93 = local_950.jstride * 8;
                            lVar60 = local_a50.jstride * 8;
                            lVar81 = local_880.jstride * 8;
                            uVar65 = ~local_bd0.begin.x;
                            lVar61 = (lVar78 - local_c10.begin.z) * local_c10.kstride;
                            lVar62 = local_a10.nstride * local_e28;
                            lVar103 = (lVar78 - local_800.begin.z) * local_800.kstride;
                            lVar71 = local_950.nstride * local_ea0 +
                                     (lVar54 - local_950.begin.y) * lVar93 +
                                     (lVar78 - local_950.begin.z) * local_950.kstride * 8 +
                                     (long)local_950.begin.x * -8 + (long)local_950.p;
                            lVar89 = (lVar78 - local_b58.begin.z) * local_b58.kstride;
                            lVar94 = (lVar78 - local_a90.begin.z) * local_a90.kstride;
                            lVar87 = local_ad0.nstride * local_e28;
                            local_fc8 = (int *)(local_a50.nstride * local_ea0 +
                                                (lVar54 - local_a50.begin.y) * lVar60 +
                                                (iVar13 - local_a50.begin.z) * local_a50.kstride * 8
                                                + (long)local_a50.begin.x * -8 + (long)local_a50.p);
                            lVar66 = local_b58.nstride * local_ea0;
                            lVar82 = (lVar78 - local_9d0.begin.z) * local_9d0.kstride;
                            lVar72 = local_990.nstride * local_ea0;
                            lVar79 = (lVar78 - local_bd0.begin.z) * local_bd0.kstride;
                            lVar63 = (~local_c50.begin.z + iVar13) * local_c50.kstride;
                            lVar88 = local_a90.nstride * local_ea0;
                            local_f58 = (int *)((lVar54 - local_7c0.begin.y) * local_7c0.jstride * 4
                                                + (lVar78 - local_7c0.begin.z) * local_7c0.kstride *
                                                  4 + (long)((iVar14 + 1) - local_7c0.begin.x) * 4 +
                                               (long)local_7c0.p);
                            lVar98 = (lVar54 - local_880.begin.y) * lVar81 +
                                     (lVar78 - local_880.begin.z) * local_880.kstride * 8 +
                                     (long)local_880.begin.x * -8 + (long)local_880.p;
                            lVar92 = local_9d0.nstride * local_ea0;
                            lVar44 = (long)local_b58.begin.x;
                            lVar45 = (long)local_b58.begin.y;
                            local_c80 = local_b58.p;
                            lVar46 = (long)local_990.begin.x;
                            lVar47 = (long)local_990.begin.y;
                            lVar48 = (long)local_990.begin.z;
                            local_ce8 = CONCAT44(local_ce8._4_4_,iVar84);
                            lVar49 = (long)local_bd0.begin.y;
                            local_c88 = (long)local_9d0.begin.x;
                            local_c90 = (double *)(long)local_9d0.begin.y;
                            lVar50 = (long)local_c50.begin.x;
                            local_c70 = (long)local_c50.begin.y;
                            local_ca0 = (long)local_a90.begin.x;
                            local_ca8 = (long)local_a90.begin.y;
                            lVar51 = (long)local_840.begin.x;
                            local_c78 = (double *)(long)local_840.begin.y;
                            local_cd0 = local_d30.p;
                            memset(local_648,0,local_8a0);
                            local_c98 = (long)local_b58.begin.x;
                            local_cb0 = (size_t)local_b58.begin.y;
                            local_cb8 = pdVar129 +
                                        (lVar54 - local_cb0) * local_b58.jstride +
                                        (lVar56 - local_c98);
                            local_cc0 = lVar78 - local_b58.begin.z;
                            local_cc8 = (ulong)local_d30.begin.x;
                            lVar69 = LVar31 * 8;
                            lVar47 = (lVar54 - lVar47) * lVar69;
                            lVar90 = (lVar78 - lVar48) * LVar33 * 8 + lVar47 + lVar72 + lVar46 * -8
                                     + (long)pdVar25;
                            lVar47 = (iVar68 - lVar48) * LVar33 * 8 + lVar47 + lVar72 + lVar46 * -8
                                     + (long)pdVar25;
                            lVar85 = local_d30.jstride * 8;
                            lVar72 = (lVar54 - local_d30.begin.y) * lVar85;
                            lVar48 = local_d30.kstride * 8;
                            lVar46 = local_d30.nstride * local_ea0;
                            lVar83 = (lVar78 - local_d30.begin.z) * lVar48;
                            local_fa0 = local_910.nstride * local_ea0 +
                                        (lVar54 - local_910.begin.y) * local_910.jstride * 8 +
                                        (lVar78 - local_910.begin.z) * local_910.kstride * 8 +
                                        (long)local_910.begin.x * -8 + (long)pdVar26;
                            local_fd8 = (int *)(local_b10.nstride * local_ea0 +
                                                (lVar54 - local_b10.begin.y) * local_b10.jstride * 8
                                                + (iVar86 - local_b10.begin.z) * local_b10.kstride *
                                                  8 + (long)local_b10.begin.x * -8 + (long)pdVar24);
                            local_fd0 = (double *)
                                        ((long)local_fd0 +
                                        (lVar54 - local_ca8) * LVar22 * 8 + lVar94 * 8 + lVar88 +
                                        local_ca0 * -8 + lVar67);
                            local_f90 = (double *)
                                        ((long)local_f90 +
                                        (lVar54 - (long)local_c90) * LVar27 * 8 + lVar82 * 8 +
                                        lVar92 + local_c88 * -8 + uVar35);
                            lVar82 = LVar38 * 4;
                            lVar92 = (lVar54 - (long)local_c78) * lVar82 +
                                     ((iVar86 + 1) - local_840.begin.z) * local_840.kstride * 4 +
                                     lVar51 * -4 + (long)piVar37;
                            local_1008 = (double *)
                                         ((lVar54 - lVar49) * LVar11 * 4 + lVar79 * 4 +
                                          (long)(int)(uVar65 + iVar91) * 4 + (long)piVar10);
                            local_1000 = (double *)
                                         ((lVar54 - local_bd0.begin.y) * local_bd0.jstride * 4 +
                                          (lVar78 - local_bd0.begin.z) * local_bd0.kstride * 4 +
                                          (long)(~local_bd0.begin.x + iVar91) * 4 + (long)piVar10);
                            local_e38 = (int *)((lVar54 - local_c70) * LVar8 * 4 + lVar63 * 4 +
                                                lVar50 * -4 + (long)piVar7);
                            local_fe8 = (double *)
                                        ((lVar54 - local_c50.begin.y) * local_c50.jstride * 4 +
                                         (~local_c50.begin.z + iVar13) * local_c50.kstride * 4 +
                                         (long)local_c50.begin.x * -4 + (long)piVar7);
                            lVar67 = lVar72 + lVar83;
                            lVar88 = ((long)iVar68 - (long)local_d30.begin.z) * lVar48 + lVar72 +
                                     lVar46 + local_cc8 * -8 + (long)local_cd0;
                            local_f98 = ((int)local_ce8 - local_d30.begin.z) * lVar48 + lVar72 +
                                        lVar46 + local_cc8 * -8 + (long)local_cd0;
                            local_fb0 = (double *)(lVar67 + local_cc8 * -8 + (long)local_cd0);
                            local_fc0 = lVar67 + (long)(~local_d30.begin.x + iVar96) * 8 +
                                        (long)local_cd0;
                            lVar51 = (lVar97 - local_d30.begin.y) * lVar85 + local_cc8 * -8 +
                                     (long)local_cd0;
                            lVar50 = LVar21 * 8;
                            lVar49 = (lVar54 - lVar45) * lVar50 + lVar89 * 8 + lVar66 + lVar44 * -8
                                     + (long)local_c80;
                            lVar48 = local_b58.nstride * local_ea0 +
                                     (lVar97 - local_cb0) * local_b58.jstride * 8 +
                                     local_cc0 * local_b58.kstride * 8 + local_c98 * -8 +
                                     (long)local_c80;
                            lVar67 = (lVar97 - lVar45) * lVar50 + lVar89 * 8 + lVar66 + lVar44 * -8
                                     + (long)local_c80;
                            lVar44 = 0;
                            lVar66 = lVar92;
                            do {
                              dVar112 = *(double *)(lVar71 + lVar57);
                              dVar115 = *(double *)(lVar71 + lVar53);
                              dVar123 = *(double *)(lVar98 + lVar57);
                              dVar127 = *(double *)(lVar49 + lVar57);
                              dVar126 = *(double *)(lVar67 + lVar57);
                              dVar2 = *(double *)(lVar90 + lVar57);
                              dVar3 = *(double *)(lVar47 + lVar57);
                              dVar124 = 0.0;
                              dVar116 = 0.0;
                              if ((iVar96 == iVar91) && (0 < *(int *)local_1008)) {
                                dVar116 = *local_f90;
                              }
                              if ((lVar58 - lVar54 == lVar44) &&
                                 (0 < piVar9[lVar75 + (lVar56 - lVar74) + lVar61])) {
                                dVar124 = local_c60[lVar62];
                              }
                              dVar125 = 0.0;
                              dVar133 = 0.0;
                              if ((iVar43 == iVar13) && (0 < *(int *)((long)local_e38 + lVar56 * 4))
                                 ) {
                                dVar133 = *(double *)((long)local_fc8 + lVar57);
                              }
                              if ((iVar96 == iVar14) && (0 < *local_f58)) {
                                dVar125 = *local_fd0;
                              }
                              dVar117 = 0.0;
                              dVar118 = 0.0;
                              if ((lVar55 - lVar54 == lVar44) &&
                                 (0 < piVar39[lVar77 + (lVar56 - lVar76) + lVar103])) {
                                dVar118 = local_c68[lVar87];
                              }
                              if ((iVar43 == iVar86) && (0 < *(int *)(lVar66 + lVar56 * 4))) {
                                dVar117 = *(double *)((long)local_fd8 + lVar57);
                              }
                              dVar130 = *(double *)((long)local_fb0 + lVar53 + lVar46);
                              dVar128 = (dVar112 * *(double *)(local_fc0 + lVar46) +
                                        dVar115 * dVar130) * dVar119 +
                                        (dVar2 * *(double *)(local_f98 + lVar57) +
                                        dVar3 * *(double *)(lVar88 + lVar57)) * dVar114;
                              if ((iVar96 == iVar91) && (0 < *(int *)local_1000)) {
                                dVar128 = dVar128 - dVar119 * dVar112 *
                                                    *(double *)(local_fc0 + lVar46);
                              }
                              if ((iVar96 == iVar14) && (0 < *local_f58)) {
                                dVar128 = dVar128 - dVar119 * dVar115 * dVar130;
                              }
                              if ((iVar43 == iVar13) && (0 < *(int *)((long)local_fe8 + lVar56 * 4))
                                 ) {
                                dVar128 = dVar128 - dVar114 * dVar2 *
                                                    *(double *)(local_f98 + lVar57);
                              }
                              if ((iVar43 == iVar86) && (0 < *(int *)(lVar92 + lVar56 * 4))) {
                                dVar128 = dVar128 - dVar114 * dVar3 * *(double *)(lVar88 + lVar57);
                              }
                              (&local_548[0].p)[lVar44] = (int *)(dVar127 * local_6c8);
                              adStack_228[lVar44 + -1] =
                                   ((dVar2 + dVar3) * dVar114 +
                                   (dVar127 + dVar126) * dVar122 +
                                   dVar123 * local_c58 + (dVar112 + dVar115) * dVar119) -
                                   ((dVar2 * dVar133 + dVar3 * dVar117) * dVar114 +
                                   (dVar112 * dVar116 + dVar115 * dVar125) * dVar119 +
                                   (dVar124 * dVar127 + dVar126 * dVar118) * dVar122);
                              dVar112 = *(double *)(lVar48 + lVar57);
                              adStack_330[lVar44] = dVar112 * local_6c8;
                              pdVar129 = (double *)(dVar128 + *(double *)(local_fa0 + lVar57));
                              adStack_440[lVar44 + -1] = (double)pdVar129;
                              if ((lVar44 == 0) &&
                                 (local_548[0].p = (int *)0x0,
                                 piVar9[(~local_c10.begin.y + iVar12) * local_c10.jstride +
                                        (lVar56 - local_c10.begin.x) +
                                        (lVar78 - local_c10.begin.z) * local_c10.kstride] < 1)) {
                                pdVar129 = (double *)
                                           ((double)pdVar129 +
                                           local_cb8[local_cc0 * local_b58.kstride +
                                                     local_b58.nstride * local_e28] * dVar122 *
                                           pdVar64[(~local_d30.begin.y + iVar17) * local_d30.jstride
                                                   + (long)(iVar96 - local_d30.begin.x) +
                                                     (iVar43 - local_d30.begin.z) *
                                                     local_d30.kstride +
                                                     local_d30.nstride * local_e28]);
                                local_448 = pdVar129;
                              }
                              if ((lVar102 == lVar44) &&
                                 (adStack_330[lVar44] = 0.0,
                                 piVar39[lVar77 + (lVar56 - lVar76) + lVar103] < 1)) {
                                adStack_440[lVar44 + -1] =
                                     dVar112 * dVar122 *
                                     *(double *)(lVar51 + lVar83 + lVar57 + lVar46) +
                                     (double)pdVar129;
                              }
                              lVar44 = lVar44 + 1;
                              lVar71 = lVar71 + lVar93;
                              lVar49 = lVar49 + lVar50;
                              lVar90 = lVar90 + lVar69;
                              lVar47 = lVar47 + lVar69;
                              lVar88 = lVar88 + lVar85;
                              local_f98 = local_f98 + lVar85;
                              local_fb0 = (double *)((long)local_fb0 + lVar85);
                              local_fc0 = local_fc0 + lVar85;
                              local_fa0 = local_fa0 + local_910.jstride * 8;
                              local_fd8 = (int *)((long)local_fd8 + local_b10.jstride * 8);
                              local_fd0 = local_fd0 + LVar22;
                              local_fc8 = (int *)((long)local_fc8 + lVar60);
                              local_f90 = local_f90 + LVar27;
                              local_1008 = (double *)((long)local_1008 + LVar11 * 4);
                              local_e38 = (int *)((long)local_e38 + LVar8 * 4);
                              local_f58 = local_f58 + LVar40;
                              lVar66 = lVar66 + lVar82;
                              local_1000 = (double *)((long)local_1000 + local_bd0.jstride * 4);
                              local_fe8 = (double *)((long)local_fe8 + local_c50.jstride * 4);
                              lVar92 = lVar92 + lVar82;
                              lVar98 = lVar98 + lVar81;
                              lVar51 = lVar51 + lVar85;
                              lVar48 = lVar48 + local_b58.jstride * 8;
                              lVar67 = lVar67 + lVar50;
                            } while (iVar73 != (int)lVar44);
                            local_1000 = local_230;
                            local_fe8 = local_448;
                            lVar66 = local_898;
                            uVar59 = local_cf0;
                            iVar84 = (int)local_ce8;
                          }
                          local_f58 = (int *)((double)local_fe8 / (double)local_1000);
                          local_648[0] = (double)local_f58;
                          if (0 < (int)uVar42) {
                            lVar67 = 0;
                            local_1008 = local_1000;
                            do {
                              dVar115 = *(double *)((long)adStack_330 + lVar67) / (double)local_1008
                              ;
                              *(double *)((long)adStack_128 + lVar67) = dVar115;
                              dVar112 = *(double *)((long)&local_548[0].jstride + lVar67);
                              local_1008 = (double *)
                                           (*(double *)((long)adStack_228 + lVar67) -
                                           dVar115 * dVar112);
                              if (((double)local_1008 == 0.0) && (!NAN((double)local_1008))) {
                                Abort_host(">>>TRIDIAG FAILED");
                              }
                              local_f58 = (int *)(((double)local_f58 * -dVar112 +
                                                  *(double *)((long)adStack_440 + lVar67)) /
                                                 (double)local_1008);
                              *(int **)((long)local_648 + lVar67 + 8) = local_f58;
                              lVar67 = lVar67 + 8;
                            } while ((ulong)(uVar42 + 1) * 8 + -8 != lVar67);
                            uVar59 = local_cf0;
                            if (0 < (int)uVar42) {
                              dVar112 = local_648[local_8b8];
                              lVar67 = local_8c0;
                              do {
                                dVar112 = local_648[lVar67 + -2] -
                                          dVar112 * adStack_128[lVar67 + -2];
                                local_648[lVar67 + -2] = dVar112;
                                lVar67 = lVar67 + -1;
                              } while (1 < lVar67);
                            }
                          }
                          if (iVar17 <= (int)lVar66) {
                            pdVar64 = (double *)
                                      ((long)local_d30.p +
                                      local_d30.nstride * local_ea0 +
                                      (lVar54 - local_d30.begin.y) * local_d30.jstride * 8 +
                                      (lVar78 - local_d30.begin.z) * local_d30.kstride * 8 +
                                      (long)local_d30.begin.x * -8 + lVar57);
                            lVar67 = 0;
                            do {
                              *pdVar64 = local_648[lVar67];
                              lVar67 = lVar67 + 1;
                              pdVar64 = pdVar64 + local_d30.jstride;
                            } while (iVar73 != (int)lVar67);
                          }
                        }
                        iVar84 = iVar84 + 1;
                        bVar109 = iVar43 != iVar20;
                        iVar80 = local_888;
                        iVar43 = iVar43 + 1;
                      } while (bVar109);
                    }
                    iVar96 = iVar96 + 1;
                  } while (iVar96 != iVar80);
                }
                local_e28 = local_e28 + 1;
                local_ea0 = local_ea0 + 8;
              } while (local_e28 != local_ce0);
            }
          }
          else if (0 < (int)uVar41) {
            pdVar64 = (double *)(long)iVar16;
            __n = (ulong)uVar95 * 8 + 8;
            lVar66 = (long)pdVar64 * 8;
            local_8a0 = lVar57 - (long)pdVar64;
            local_8c0 = CONCAT44(local_8c0._4_4_,iVar18 + 1);
            local_8a8 = (long)pdVar64 * 4;
            local_8b8 = uVar59 + 1;
            local_ed0 = 0;
            local_f48 = 0;
            local_cd0 = pdVar64;
            local_8b0 = uVar59;
            do {
              if (iVar17 <= (int)local_898) {
                local_cc8 = local_f48 * 8;
                uVar65 = iVar17;
                do {
                  if (iVar18 <= iVar20) {
                    iVar84 = (int)local_cd8;
                    iVar80 = iVar18 + -1;
                    iVar96 = (int)local_8c0;
                    iVar68 = iVar18;
                    do {
                      piVar39 = local_800.p;
                      piVar37 = local_840.p;
                      pdVar36 = local_880.p;
                      lVar58 = local_8a8;
                      pdVar34 = local_910.p;
                      pdVar32 = local_990.p;
                      pdVar30 = local_9d0.p;
                      pdVar29 = local_a10.p;
                      pdVar28 = local_a50.p;
                      pdVar26 = local_a90.p;
                      pdVar25 = local_ad0.p;
                      pdVar24 = local_b10.p;
                      LVar8 = local_b58.jstride;
                      piVar10 = local_bd0.p;
                      piVar9 = local_c10.p;
                      piVar7 = local_c50.p;
                      pdVar129 = local_d30.p;
                      if ((iVar84 + uVar65 + iVar68 & 1) == 0) {
                        lVar102 = (long)iVar68;
                        if (iVar16 <= iVar19) {
                          iVar43 = uVar65 - local_b58.begin.y;
                          iVar52 = (uVar65 + 1) - local_b58.begin.y;
                          uVar70 = ~local_bd0.begin.x;
                          lVar67 = (long)(int)uVar65;
                          lVar83 = (lVar67 - local_bd0.begin.y) * local_bd0.jstride;
                          lVar71 = (long)local_9d0.begin.x;
                          lVar85 = (lVar67 - local_9d0.begin.y) * local_9d0.jstride;
                          lVar89 = (lVar102 - local_9d0.begin.z) * local_9d0.kstride;
                          local_fe8 = (double *)
                                      (local_7c0.p +
                                      (lVar67 - local_7c0.begin.y) * local_7c0.jstride +
                                      (long)((iVar14 + 1) - local_7c0.begin.x));
                          lVar77 = (long)local_a90.begin.x;
                          lVar78 = (lVar67 - local_a90.begin.y) * local_a90.jstride;
                          lVar94 = (lVar102 - local_a90.begin.z) * local_a90.kstride;
                          lVar104 = (lVar102 - local_bd0.begin.z) * local_bd0.kstride;
                          lVar61 = local_9d0.nstride * local_f48;
                          lVar72 = (lVar102 - local_7c0.begin.z) * local_7c0.kstride;
                          lVar81 = local_a90.nstride * local_f48;
                          local_c90 = local_950.p + (long)pdVar64;
                          local_c98 = (int)(uVar65 - local_950.begin.y) * local_950.jstride;
                          lVar54 = (lVar102 - local_950.begin.z) * local_950.kstride;
                          local_ca0 = local_950.nstride * local_ed0;
                          local_c80 = local_b58.p + (long)pdVar64;
                          lVar62 = (lVar102 - local_b58.begin.z) * local_b58.kstride;
                          local_c88 = local_b58.nstride * local_ed0;
                          local_c78 = (double *)
                                      ((int)(uVar65 - local_990.begin.y) * local_990.jstride);
                          local_c70 = local_990.nstride * local_ed0;
                          lVar99 = (iVar15 - local_ad0.begin.y) * local_ad0.jstride;
                          lVar87 = (lVar102 - local_ad0.begin.z) * local_ad0.kstride;
                          lVar88 = local_ad0.nstride * local_ed0;
                          local_c60 = (double *)
                                      ((int)(uVar65 - local_a50.begin.y) * local_a50.jstride);
                          lVar75 = (iVar13 - local_a50.begin.z) * local_a50.kstride;
                          local_c68 = (double *)(local_a50.nstride * local_ed0);
                          lVar93 = (iVar12 - local_a10.begin.y) * local_a10.jstride;
                          lVar92 = (lVar102 - local_a10.begin.z) * local_a10.kstride;
                          lVar44 = local_a10.nstride * local_ed0;
                          lVar63 = (lVar102 - local_c10.begin.z) * local_c10.kstride;
                          lVar98 = (~local_c10.begin.y + iVar12) * local_c10.jstride;
                          lVar76 = (int)(uVar65 - local_c50.begin.y) * local_c50.jstride;
                          lVar105 = (~local_c50.begin.z + iVar13) * local_c50.kstride;
                          lVar69 = (lVar102 - local_800.begin.z) * local_800.kstride;
                          lVar103 = (int)((iVar15 + 1U) - local_800.begin.y) * local_800.jstride;
                          lVar82 = (int)(uVar65 - local_840.begin.y) * local_840.jstride;
                          lVar45 = (int)(uVar65 - local_880.begin.y) * local_880.jstride;
                          lVar46 = (lVar102 - local_880.begin.z) * local_880.kstride;
                          lVar47 = (long)local_880.begin.x;
                          lVar60 = (long)local_950.begin.x;
                          lVar106 = (long)local_b58.begin.x;
                          local_ca8 = (long)local_990.begin.x;
                          local_cc0 = (long)local_990.begin.z;
                          local_cb0 = local_990.kstride;
                          lVar48 = (long)local_c10.begin.x;
                          lVar49 = (long)local_a10.begin.x;
                          lVar50 = (long)local_c50.begin.x;
                          lVar51 = (long)local_a50.begin.x;
                          lVar55 = (long)local_800.begin.x;
                          local_ce8 = (long)local_ad0.begin.x;
                          lVar56 = (long)local_840.begin.x;
                          memset(local_648,0,__n);
                          local_cf0 = CONCAT44(local_cf0._4_4_,iVar86 - local_b10.begin.z);
                          local_cb8 = (double *)(long)(int)(uVar65 - local_d30.begin.y);
                          lVar74 = (long)local_d30.begin.x;
                          lVar79 = lVar54 * 8 + local_c98 * 8 + local_ca0 + lVar60 * -8;
                          lVar100 = lVar102 - local_d30.begin.z;
                          lVar54 = local_d30.kstride * 8;
                          lVar60 = local_d30.jstride * 8;
                          lVar90 = local_d30.nstride * local_ed0;
                          lVar107 = lVar54 * lVar100 + lVar90;
                          lVar55 = lVar103 * 4 + lVar69 * 4 + lVar55 * -4 + lVar58;
                          lVar56 = ((iVar86 + 1) - local_840.begin.z) * local_840.kstride * 4 +
                                   lVar82 * 4 + lVar56 * -4 + lVar58;
                          sVar101 = 0;
                          do {
                            dVar112 = *(double *)((long)local_c90 + sVar101 * 8 + lVar79);
                            dVar115 = *(double *)((long)local_c90 + sVar101 * 8 + lVar79 + 8);
                            dVar123 = pdVar36[(long)pdVar64 + ((lVar45 + lVar46 + sVar101) - lVar47)
                                             ];
                            dVar127 = *(double *)
                                       ((long)local_c80 +
                                       sVar101 * 8 +
                                       (long)iVar43 * LVar8 * 8 + lVar62 * 8 + local_c88 +
                                       lVar106 * -8);
                            dVar126 = *(double *)
                                       ((long)local_c80 +
                                       sVar101 * 8 +
                                       LVar8 * 8 * (long)iVar52 + lVar62 * 8 + local_c88 +
                                       lVar106 * -8);
                            dVar2 = *(double *)
                                     ((long)pdVar32 +
                                     sVar101 * 8 +
                                     (lVar102 - local_cc0) * local_cb0 * 8 + (long)local_c78 * 8 +
                                     local_c70 + local_ca8 * -8 + lVar66);
                            dVar3 = *(double *)
                                     ((long)pdVar32 +
                                     sVar101 * 8 +
                                     (iVar96 - local_cc0) * local_cb0 * 8 + (long)local_c78 * 8 +
                                     local_c70 + local_ca8 * -8 + lVar66);
                            dVar124 = 0.0;
                            dVar116 = 0.0;
                            if ((local_8a0 == sVar101) &&
                               (0 < piVar10[lVar83 + (int)(uVar70 + iVar91) + lVar104])) {
                              dVar116 = pdVar30[lVar85 + (lVar57 - lVar71) + lVar89 + lVar61];
                            }
                            if ((uVar65 == iVar12) &&
                               (0 < *(int *)((long)piVar9 +
                                            sVar101 * 4 +
                                            lVar98 * 4 + lVar63 * 4 + lVar48 * -4 + lVar58))) {
                              dVar124 = *(double *)
                                         ((long)pdVar29 +
                                         sVar101 * 8 +
                                         lVar92 * 8 + lVar93 * 8 + lVar44 + lVar49 * -8 + lVar66);
                            }
                            dVar125 = 0.0;
                            dVar133 = 0.0;
                            if ((iVar68 == iVar13) &&
                               (0 < *(int *)((long)piVar7 +
                                            sVar101 * 4 +
                                            lVar105 * 4 + lVar76 * 4 + lVar50 * -4 + lVar58))) {
                              dVar133 = *(double *)
                                         ((long)pdVar28 +
                                         (long)(local_c68 +
                                               (long)local_c60 +
                                               (long)pdVar64 + lVar75 + (sVar101 - lVar51)));
                            }
                            if ((lVar53 - (long)pdVar64 == sVar101) &&
                               (0 < *(int *)((long)local_fe8 + lVar72 * 4))) {
                              dVar125 = pdVar26[lVar78 + (lVar53 - lVar77) + lVar94 + lVar81];
                            }
                            dVar118 = 0.0;
                            uVar110 = 0;
                            uVar111 = 0;
                            if ((uVar65 == iVar15) &&
                               (0 < *(int *)((long)piVar39 + sVar101 * 4 + lVar55))) {
                              uVar1 = *(undefined8 *)
                                       ((long)pdVar25 +
                                       sVar101 * 8 +
                                       lVar87 * 8 + lVar99 * 8 + lVar88 + local_ce8 * -8 + lVar66);
                              uVar110 = (undefined4)uVar1;
                              uVar111 = (undefined4)((ulong)uVar1 >> 0x20);
                            }
                            if ((iVar68 == iVar86) &&
                               (0 < *(int *)((long)piVar37 + sVar101 * 4 + lVar56))) {
                              dVar118 = *(double *)
                                         ((long)pdVar24 +
                                         sVar101 * 8 +
                                         local_b10.nstride * local_ed0 +
                                         (iVar86 - local_b10.begin.z) * local_b10.kstride * 8 +
                                         (int)(uVar65 - local_b10.begin.y) * local_b10.jstride * 8 +
                                         (long)local_b10.begin.x * -8 + lVar66);
                            }
                            dVar117 = *(double *)
                                       ((long)pdVar129 +
                                       sVar101 * 8 +
                                       (int)(~local_d30.begin.y + uVar65) * lVar60 + lVar107 +
                                       lVar74 * -8 + lVar66);
                            dVar130 = *(double *)
                                       ((long)pdVar129 +
                                       sVar101 * 8 +
                                       (int)((uVar65 + 1) - local_d30.begin.y) * lVar60 + lVar107 +
                                       lVar74 * -8 + lVar66);
                            dVar128 = *(double *)
                                       ((long)pdVar129 +
                                       sVar101 * 8 +
                                       (iVar80 - local_d30.begin.z) * lVar54 +
                                       lVar60 * (long)local_cb8 + lVar90 + lVar74 * -8 + lVar66);
                            dVar4 = *(double *)
                                     ((long)pdVar129 +
                                     sVar101 * 8 +
                                     ((long)iVar96 - (long)local_d30.begin.z) * lVar54 + lVar90 +
                                     lVar60 * (long)local_cb8 + lVar74 * -8 + lVar66);
                            dVar131 = (dVar127 * dVar117 + dVar126 * dVar130) * dVar122 +
                                      (dVar2 * dVar128 + dVar3 * dVar4) * dVar114;
                            if ((uVar65 == iVar12) &&
                               (0 < *(int *)((long)piVar9 +
                                            sVar101 * 4 +
                                            (~local_c10.begin.y + iVar12) * local_c10.jstride * 4 +
                                            (lVar102 - local_c10.begin.z) * local_c10.kstride * 4 +
                                            (long)local_c10.begin.x * -4 + lVar58))) {
                              dVar131 = dVar131 - dVar122 * dVar127 * dVar117;
                            }
                            if ((uVar65 == iVar15) &&
                               (0 < *(int *)((long)piVar39 + sVar101 * 4 + lVar55))) {
                              dVar131 = dVar131 - dVar122 * dVar126 * dVar130;
                            }
                            if ((iVar68 == iVar13) &&
                               (0 < *(int *)((long)piVar7 +
                                            sVar101 * 4 +
                                            (int)(uVar65 - local_c50.begin.y) * local_c50.jstride *
                                            4 + (~local_c50.begin.z + iVar13) * local_c50.kstride *
                                                4 + (long)local_c50.begin.x * -4 + lVar58))) {
                              dVar131 = dVar131 - dVar114 * dVar2 * dVar128;
                            }
                            if ((iVar68 == iVar86) &&
                               (0 < *(int *)((long)piVar37 + sVar101 * 4 + lVar56))) {
                              dVar131 = dVar131 - dVar114 * dVar3 * dVar4;
                            }
                            (&local_548[0].p)[sVar101] = (int *)(dVar112 * local_6b8._0_8_);
                            adStack_228[sVar101 - 1] =
                                 ((dVar2 + dVar3) * dVar114 +
                                 (dVar127 + dVar126) * dVar122 +
                                 dVar123 * local_c58 + (dVar112 + dVar115) * dVar119) -
                                 ((dVar2 * dVar133 + dVar3 * dVar118) * dVar114 +
                                 (dVar116 * dVar112 + dVar125 * dVar115) * dVar119 +
                                 (dVar127 * dVar124 + dVar126 * (double)CONCAT44(uVar111,uVar110)) *
                                 dVar122);
                            adStack_330[sVar101] = dVar115 * local_6b8._0_8_;
                            pdVar132 = (double *)
                                       (dVar131 +
                                       *(double *)
                                        ((long)pdVar34 +
                                        sVar101 * 8 +
                                        local_910.nstride * local_ed0 +
                                        (lVar102 - local_910.begin.z) * local_910.kstride * 8 +
                                        (int)(uVar65 - local_910.begin.y) * local_910.jstride * 8 +
                                        (long)local_910.begin.x * -8 + lVar66));
                            adStack_440[sVar101 - 1] = (double)pdVar132;
                            if ((sVar101 == 0) &&
                               (local_548[0].p = (int *)0x0,
                               piVar10[(lVar67 - local_bd0.begin.y) * local_bd0.jstride +
                                       (long)(~local_bd0.begin.x + iVar91) +
                                       (lVar102 - local_bd0.begin.z) * local_bd0.kstride] < 1)) {
                              pdVar132 = (double *)
                                         ((double)pdVar132 +
                                         dVar112 * dVar119 *
                                         pdVar129[local_d30.jstride * (long)local_cb8 +
                                                  (long)(~local_d30.begin.x + iVar16) +
                                                  (iVar68 - local_d30.begin.z) * local_d30.kstride +
                                                  local_d30.nstride * local_f48]);
                              local_448 = pdVar132;
                            }
                            if ((lVar97 - (long)pdVar64 == sVar101) &&
                               (adStack_330[sVar101] = 0.0,
                               *(int *)((long)local_fe8 + lVar72 * 4) < 1)) {
                              adStack_440[sVar101 - 1] =
                                   dVar115 * dVar119 *
                                   *(double *)
                                    ((long)pdVar129 +
                                    sVar101 * 8 +
                                    lVar90 + ((long)local_cd0 +
                                             local_d30.jstride * (long)local_cb8 +
                                             lVar100 * local_d30.kstride) * 8 + lVar74 * -8 + 8) +
                                   (double)pdVar132;
                            }
                            sVar101 = sVar101 + 1;
                          } while ((iVar19 - iVar16) + 1 != (int)sVar101);
                          local_1008 = local_230;
                          local_1000 = local_448;
                        }
                        local_1010 = (double)local_1000 / (double)local_1008;
                        local_648[0] = local_1010;
                        if (0 < (int)uVar42) {
                          lVar58 = 0;
                          pdVar129 = local_1008;
                          do {
                            dVar115 = *(double *)((long)adStack_330 + lVar58) / (double)pdVar129;
                            *(double *)((long)adStack_128 + lVar58) = dVar115;
                            dVar112 = *(double *)((long)&local_548[0].jstride + lVar58);
                            pdVar129 = (double *)
                                       (*(double *)((long)adStack_228 + lVar58) - dVar115 * dVar112)
                            ;
                            if (((double)pdVar129 == 0.0) && (!NAN((double)pdVar129))) {
                              Abort_host(">>>TRIDIAG FAILED");
                            }
                            local_1010 = (local_1010 * -dVar112 +
                                         *(double *)((long)adStack_440 + lVar58)) / (double)pdVar129
                            ;
                            *(double *)((long)local_648 + lVar58 + 8) = local_1010;
                            lVar58 = lVar58 + 8;
                          } while ((ulong)(uVar42 + 1) * 8 + -8 != lVar58);
                          if (0 < (int)uVar42) {
                            dVar112 = local_648[local_8b0];
                            uVar59 = local_8b8;
                            do {
                              dVar112 = local_648[uVar59 - 2] - dVar112 * adStack_128[uVar59 - 2];
                              local_648[uVar59 - 2] = dVar112;
                              uVar59 = uVar59 - 1;
                            } while (1 < (long)uVar59);
                          }
                        }
                        if (iVar16 <= iVar19) {
                          memcpy((void *)((long)local_d30.p +
                                         local_d30.nstride * local_cc8 +
                                         (lVar102 - local_d30.begin.z) * local_d30.kstride * 8 +
                                         ((long)(int)uVar65 - (long)local_d30.begin.y) *
                                         local_d30.jstride * 8 + (long)local_d30.begin.x * -8 +
                                         lVar66),local_648,__n);
                        }
                      }
                      iVar96 = iVar96 + 1;
                      iVar80 = iVar80 + 1;
                      bVar109 = iVar68 != iVar20;
                      iVar68 = iVar68 + 1;
                    } while (bVar109);
                  }
                  uVar65 = uVar65 + 1;
                } while (uVar65 != iVar73 + 1U);
              }
              local_f48 = local_f48 + 1;
              local_ed0 = local_ed0 + 8;
            } while (local_f48 != local_ce0);
          }
        }
      }
      else {
        FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                  (local_548,
                   (FabArray<amrex::IArrayBox> *)
                   this_00._M_t.
                   super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                   .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl,&local_6a8);
        if (0 < (int)uVar41) {
          lVar97 = (long)local_b74.smallend.vect[0];
          lVar66 = lVar97 * 8;
          local_f80 = 0;
          local_f30 = 0;
          do {
            iVar91 = local_b74.smallend.vect[2];
            if (local_b74.smallend.vect[2] <= local_b74.bigend.vect[2]) {
              do {
                if (local_b74.smallend.vect[1] <= local_b74.bigend.vect[1]) {
                  uVar42 = local_b74.smallend.vect[1];
                  do {
                    if (local_b74.smallend.vect[0] <= local_b74.bigend.vect[0]) {
                      lVar87 = (long)(int)uVar42;
                      lVar53 = (long)iVar91;
                      lVar57 = local_950.nstride * local_f80 +
                               (iVar91 - local_950.begin.z) * local_950.kstride * 8 +
                               (int)(uVar42 - local_950.begin.y) * local_950.jstride * 8 +
                               (long)local_950.begin.x * -8 + lVar66;
                      lVar88 = (iVar91 - local_b58.begin.z) * local_b58.kstride;
                      lVar81 = (int)(uVar42 - local_990.begin.y) * local_990.jstride;
                      lVar78 = local_d30.jstride * 8;
                      lVar54 = (int)(uVar42 - local_d30.begin.y) * lVar78;
                      lVar67 = local_d30.kstride * 8;
                      lVar102 = (iVar91 - local_d30.begin.z) * lVar67;
                      lVar92 = local_d30.nstride * local_f80;
                      lVar55 = (long)local_d30.begin.x;
                      uVar65 = (local_b74.smallend.vect[0] + -1) - local_d30.begin.x;
                      local_1000 = (double *)(ulong)uVar65;
                      lVar58 = lVar54 + lVar102 + lVar92 + lVar55 * -8 + lVar66;
                      local_1008 = (double *)
                                   ((long)local_d30.p +
                                   (int)((uVar42 + 1) - local_d30.begin.y) * lVar78 + lVar102 +
                                   lVar92 + lVar55 * -8 + lVar66);
                      local_fe8 = (double *)(ulong)(uint)local_b90.bigend.vect[1];
                      lVar56 = 0;
                      do {
                        if (((int)local_cd8 + local_b74.smallend.vect[0] + iVar91 + uVar42 +
                             (int)lVar56 & 1) == 0) {
                          if (local_548[0].p
                              [lVar97 + (((int)(uVar42 - local_548[0].begin.y) *
                                          local_548[0].jstride +
                                         (iVar91 - local_548[0].begin.z) * local_548[0].kstride +
                                         lVar56) - (long)local_548[0].begin.x)] == 0) {
                            *(undefined8 *)((long)local_d30.p + lVar56 * 8 + lVar58) = 0;
                          }
                          else {
                            uVar110 = 0;
                            uVar111 = 0;
                            dVar112 = 0.0;
                            if (((long)local_b90.smallend.vect[0] + -lVar97 == lVar56) &&
                               (0 < local_bd0.p
                                    [(lVar87 - local_bd0.begin.y) * local_bd0.jstride +
                                     (long)(~local_bd0.begin.x + local_b90.smallend.vect[0]) +
                                     (lVar53 - local_bd0.begin.z) * local_bd0.kstride])) {
                              dVar112 = local_9d0.p
                                        [(lVar87 - local_9d0.begin.y) * local_9d0.jstride +
                                         ((long)local_b90.smallend.vect[0] - (long)local_9d0.begin.x
                                         ) + (lVar53 - local_9d0.begin.z) * local_9d0.kstride +
                                             local_9d0.nstride * local_f30];
                            }
                            if ((local_b90.smallend.vect[1] == uVar42) &&
                               (0 < local_c10.p
                                    [lVar97 + (((iVar91 - local_c10.begin.z) * local_c10.kstride +
                                               (~local_c10.begin.y + local_b90.smallend.vect[1]) *
                                               local_c10.jstride + lVar56) - (long)local_c10.begin.x
                                              )])) {
                              uVar1 = *(undefined8 *)
                                       ((long)local_a10.p +
                                       lVar56 * 8 +
                                       local_a10.nstride * local_f80 +
                                       (iVar91 - local_a10.begin.z) * local_a10.kstride * 8 +
                                       (local_b90.smallend.vect[1] - local_a10.begin.y) *
                                       local_a10.jstride * 8 + (long)local_a10.begin.x * -8 + lVar66
                                       );
                              uVar110 = (undefined4)uVar1;
                              uVar111 = (undefined4)((ulong)uVar1 >> 0x20);
                            }
                            dVar123 = 0.0;
                            dVar115 = 0.0;
                            if ((local_b90.smallend.vect[2] == iVar91) &&
                               (0 < local_c50.p
                                    [lVar97 + (((int)(uVar42 - local_c50.begin.y) *
                                                local_c50.jstride +
                                               (~local_c50.begin.z + local_b90.smallend.vect[2]) *
                                               local_c50.kstride + lVar56) - (long)local_c50.begin.x
                                              )])) {
                              dVar115 = *(double *)
                                         ((long)local_a50.p +
                                         lVar56 * 8 +
                                         local_a50.nstride * local_f80 +
                                         (local_b90.smallend.vect[2] - local_a50.begin.z) *
                                         local_a50.kstride * 8 +
                                         (int)(uVar42 - local_a50.begin.y) * local_a50.jstride * 8 +
                                         (long)local_a50.begin.x * -8 + lVar66);
                            }
                            if (((long)local_b90.bigend.vect[0] + -lVar97 == lVar56) &&
                               (0 < local_7c0.p
                                    [(lVar87 - local_7c0.begin.y) * local_7c0.jstride +
                                     (long)((local_b90.bigend.vect[0] - local_7c0.begin.x) + 1) +
                                     (lVar53 - local_7c0.begin.z) * local_7c0.kstride])) {
                              dVar123 = local_a90.p
                                        [(lVar87 - local_a90.begin.y) * local_a90.jstride +
                                         ((long)local_b90.bigend.vect[0] - (long)local_a90.begin.x)
                                         + (lVar53 - local_a90.begin.z) * local_a90.kstride +
                                           local_a90.nstride * local_f30];
                            }
                            dVar126 = 0.0;
                            dVar127 = 0.0;
                            if ((local_b90.bigend.vect[1] == uVar42) &&
                               (0 < local_800.p
                                    [lVar97 + (((iVar91 - local_800.begin.z) * local_800.kstride +
                                               ((local_b90.bigend.vect[1] - local_800.begin.y) + 1)
                                               * local_800.jstride + lVar56) -
                                              (long)local_800.begin.x)])) {
                              dVar127 = *(double *)
                                         ((long)local_ad0.p +
                                         lVar56 * 8 +
                                         local_ad0.nstride * local_f80 +
                                         (iVar91 - local_ad0.begin.z) * local_ad0.kstride * 8 +
                                         (local_b90.bigend.vect[1] - local_ad0.begin.y) *
                                         local_ad0.jstride * 8 + (long)local_ad0.begin.x * -8 +
                                         lVar66);
                            }
                            if ((local_b90.bigend.vect[2] == iVar91) &&
                               (0 < local_840.p
                                    [lVar97 + (((int)(uVar42 - local_840.begin.y) *
                                                local_840.jstride +
                                               ((local_b90.bigend.vect[2] - local_840.begin.z) + 1)
                                               * local_840.kstride + lVar56) -
                                              (long)local_840.begin.x)])) {
                              dVar126 = *(double *)
                                         ((long)local_b10.p +
                                         lVar56 * 8 +
                                         local_b10.nstride * local_f80 +
                                         (local_b90.bigend.vect[2] - local_b10.begin.z) *
                                         local_b10.kstride * 8 +
                                         (int)(uVar42 - local_b10.begin.y) * local_b10.jstride * 8 +
                                         (long)local_b10.begin.x * -8 + lVar66);
                            }
                            dVar2 = *(double *)((long)local_950.p + lVar56 * 8 + lVar57);
                            dVar3 = *(double *)((long)local_950.p + lVar56 * 8 + lVar57 + 8);
                            dVar116 = *(double *)
                                       ((long)local_b58.p +
                                       lVar56 * 8 +
                                       local_b58.jstride * 8 *
                                       (long)(int)(uVar42 - local_b58.begin.y) + lVar88 * 8 +
                                       local_b58.nstride * local_f80 + (long)local_b58.begin.x * -8
                                       + lVar66);
                            dVar124 = *(double *)
                                       ((long)local_b58.p +
                                       lVar56 * 8 +
                                       (long)(int)((uVar42 + 1) - local_b58.begin.y) *
                                       local_b58.jstride * 8 + lVar88 * 8 +
                                       local_b58.nstride * local_f80 + (long)local_b58.begin.x * -8
                                       + lVar66);
                            dVar133 = *(double *)
                                       ((long)local_990.p +
                                       lVar56 * 8 +
                                       local_990.kstride * 8 * (long)(iVar91 - local_990.begin.z) +
                                       lVar81 * 8 + local_990.nstride * local_f80 +
                                       (long)local_990.begin.x * -8 + lVar66);
                            dVar125 = *(double *)
                                       ((long)local_990.p +
                                       lVar56 * 8 +
                                       (long)((iVar91 + 1) - local_990.begin.z) *
                                       local_990.kstride * 8 + lVar81 * 8 +
                                       local_990.nstride * local_f80 + (long)local_990.begin.x * -8
                                       + lVar66);
                            dVar117 = (dVar133 + dVar125) * dStack_6e0 +
                                      (dVar116 + dVar124) * dVar122 +
                                      local_880.p
                                      [lVar97 + (((int)(uVar42 - local_880.begin.y) *
                                                  local_880.jstride +
                                                 (iVar91 - local_880.begin.z) * local_880.kstride +
                                                 lVar56) - (long)local_880.begin.x)] * local_c58 +
                                      (dVar2 + dVar3) * dVar119;
                            dVar118 = *(double *)((long)local_d30.p + lVar56 * 8 + lVar58);
                            *(double *)((long)local_d30.p + lVar56 * 8 + lVar58) =
                                 (1.15 / (dVar117 -
                                         ((dVar115 * dVar133 + dVar126 * dVar125) * local_6e8 +
                                         (dVar112 * dVar2 + dVar123 * dVar3) * dVar119 +
                                         ((double)CONCAT44(uVar111,uVar110) * dVar116 +
                                         dVar127 * dVar124) * dVar122))) *
                                 (*(double *)
                                   ((long)local_910.p +
                                   lVar56 * 8 +
                                   local_910.nstride * local_f80 +
                                   (iVar91 - local_910.begin.z) * local_910.kstride * 8 +
                                   (int)(uVar42 - local_910.begin.y) * local_910.jstride * 8 +
                                   (long)local_910.begin.x * -8 + lVar66) -
                                 (dVar117 * dVar118 -
                                 ((dVar133 * *(double *)
                                              ((long)local_d30.p +
                                              lVar56 * 8 +
                                              lVar92 + lVar54 +
                                              lVar67 * (~local_d30.begin.z + iVar91) + lVar55 * -8 +
                                              lVar66) +
                                  dVar125 * *(double *)
                                             ((long)local_d30.p +
                                             lVar56 * 8 +
                                             ((iVar91 + 1) - local_d30.begin.z) * lVar67 + lVar54 +
                                             lVar92 + lVar55 * -8 + lVar66)) * dVar114 +
                                 (dVar2 * local_d30.p
                                          [local_d30.jstride * (int)(uVar42 - local_d30.begin.y) +
                                           local_d30.kstride * (iVar91 - local_d30.begin.z) +
                                           local_d30.nstride * local_f30 +
                                           (long)(int)(uVar65 + (int)lVar56)] +
                                 dVar3 * *(double *)((long)local_d30.p + lVar56 * 8 + lVar58 + 8)) *
                                 dVar119 + (dVar116 * *(double *)
                                                       ((long)local_d30.p +
                                                       lVar56 * 8 +
                                                       lVar102 + lVar92 +
                                                       lVar78 * (int)(~local_d30.begin.y + uVar42) +
                                                       lVar55 * -8 + lVar66) +
                                           dVar124 * local_1008[lVar56]) * dVar122))) + dVar118;
                          }
                        }
                        lVar56 = lVar56 + 1;
                      } while ((local_b74.bigend.vect[0] - local_b74.smallend.vect[0]) + 1 !=
                               (int)lVar56);
                    }
                    uVar42 = uVar42 + 1;
                  } while (uVar42 != local_b74.bigend.vect[1] + 1U);
                }
                iVar91 = iVar91 + 1;
              } while (iVar91 != local_b74.bigend.vect[2] + 1);
            }
            local_f30 = local_f30 + 1;
            local_f80 = local_f80 + 8;
          } while (local_f30 != local_ce0);
        }
      }
      MFIter::operator++(&local_6a8);
    } while (local_6a8.currentIndex < local_6a8.endIndex);
  }
  MFIter::~MFIter(&local_6a8);
  return;
}

Assistant:

void
MLABecLaplacian::Fsmooth (int amrlev, int mglev, MultiFab& sol, const MultiFab& rhs, int redblack) const
{
    BL_PROFILE("MLABecLaplacian::Fsmooth()");

    bool regular_coarsening = true;
    if (amrlev == 0 && mglev > 0) {
        regular_coarsening = mg_coarsen_ratio_vec[mglev-1] == mg_coarsen_ratio;
    }

    const MultiFab& acoef = m_a_coeffs[amrlev][mglev];
    AMREX_ALWAYS_ASSERT(acoef.nGrowVect() == 0);
    AMREX_D_TERM(const MultiFab& bxcoef = m_b_coeffs[amrlev][mglev][0];,
                 const MultiFab& bycoef = m_b_coeffs[amrlev][mglev][1];,
                 const MultiFab& bzcoef = m_b_coeffs[amrlev][mglev][2];);
    const auto& undrrelxr = m_undrrelxr[amrlev][mglev];
    const auto& maskvals  = m_maskvals [amrlev][mglev];

    OrientationIter oitr;

    const FabSet& f0 = undrrelxr[oitr()]; ++oitr;
    const FabSet& f1 = undrrelxr[oitr()]; ++oitr;
#if (AMREX_SPACEDIM > 1)
    const FabSet& f2 = undrrelxr[oitr()]; ++oitr;
    const FabSet& f3 = undrrelxr[oitr()]; ++oitr;
#if (AMREX_SPACEDIM > 2)
    const FabSet& f4 = undrrelxr[oitr()]; ++oitr;
    const FabSet& f5 = undrrelxr[oitr()]; ++oitr;
#endif
#endif

    const MultiMask& mm0 = maskvals[0];
    const MultiMask& mm1 = maskvals[1];
#if (AMREX_SPACEDIM > 1)
    const MultiMask& mm2 = maskvals[2];
    const MultiMask& mm3 = maskvals[3];
#if (AMREX_SPACEDIM > 2)
    const MultiMask& mm4 = maskvals[4];
    const MultiMask& mm5 = maskvals[5];
#endif
#endif

    const int nc = getNComp();
    const Real* h = m_geom[amrlev][mglev].CellSize();
    AMREX_D_TERM(const Real dhx = m_b_scalar/(h[0]*h[0]);,
                 const Real dhy = m_b_scalar/(h[1]*h[1]);,
                 const Real dhz = m_b_scalar/(h[2]*h[2]));
    const Real alpha = m_a_scalar;

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && sol.isFusingCandidate()
        && (m_overset_mask[amrlev][mglev] || regular_coarsening))
    {
        const auto& m0ma = mm0.const_arrays();
        const auto& m1ma = mm1.const_arrays();
#if (AMREX_SPACEDIM > 1)
        const auto& m2ma = mm2.const_arrays();
        const auto& m3ma = mm3.const_arrays();
#if (AMREX_SPACEDIM > 2)
        const auto& m4ma = mm4.const_arrays();
        const auto& m5ma = mm5.const_arrays();
#endif
#endif

        const auto& solnma = sol.arrays();
        const auto& rhsma = rhs.const_arrays();
        const auto& ama = acoef.const_arrays();

        AMREX_D_TERM(const auto& bxma = bxcoef.const_arrays();,
                     const auto& byma = bycoef.const_arrays();,
                     const auto& bzma = bzcoef.const_arrays(););

        const auto& f0ma = f0.const_arrays();
        const auto& f1ma = f1.const_arrays();
#if (AMREX_SPACEDIM > 1)
        const auto& f2ma = f2.const_arrays();
        const auto& f3ma = f3.const_arrays();
#if (AMREX_SPACEDIM > 2)
        const auto& f4ma = f4.const_arrays();
        const auto& f5ma = f5.const_arrays();
#endif
#endif

        if (m_overset_mask[amrlev][mglev]) {
            const auto& osmma = m_overset_mask[amrlev][mglev]->const_arrays();
            ParallelFor(sol, IntVect(0), nc,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
            {
                Box vbx(ama[box_no]);
                abec_gsrb_os(i,j,k,n, solnma[box_no], rhsma[box_no], alpha, ama[box_no],
                             AMREX_D_DECL(dhx, dhy, dhz),
                             AMREX_D_DECL(bxma[box_no],byma[box_no],bzma[box_no]),
                             AMREX_D_DECL(m0ma[box_no],m2ma[box_no],m4ma[box_no]),
                             AMREX_D_DECL(m1ma[box_no],m3ma[box_no],m5ma[box_no]),
                             AMREX_D_DECL(f0ma[box_no],f2ma[box_no],f4ma[box_no]),
                             AMREX_D_DECL(f1ma[box_no],f3ma[box_no],f5ma[box_no]),
                             osmma[box_no], vbx, redblack);
            });
        } else if (regular_coarsening) {
            ParallelFor(sol, IntVect(0), nc,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
            {
                Box vbx(ama[box_no]);
                abec_gsrb(i,j,k,n, solnma[box_no], rhsma[box_no], alpha, ama[box_no],
                          AMREX_D_DECL(dhx, dhy, dhz),
                          AMREX_D_DECL(bxma[box_no],byma[box_no],bzma[box_no]),
                          AMREX_D_DECL(m0ma[box_no],m2ma[box_no],m4ma[box_no]),
                          AMREX_D_DECL(m1ma[box_no],m3ma[box_no],m5ma[box_no]),
                          AMREX_D_DECL(f0ma[box_no],f2ma[box_no],f4ma[box_no]),
                          AMREX_D_DECL(f1ma[box_no],f3ma[box_no],f5ma[box_no]),
                          vbx, redblack);
            });
        }
        Gpu::streamSynchronize();
    } else
#endif
    {
        MFItInfo mfi_info;
        if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(sol,mfi_info); mfi.isValid(); ++mfi)
        {
            const auto& m0 = mm0.array(mfi);
            const auto& m1 = mm1.array(mfi);
#if (AMREX_SPACEDIM > 1)
            const auto& m2 = mm2.array(mfi);
            const auto& m3 = mm3.array(mfi);
#if (AMREX_SPACEDIM > 2)
            const auto& m4 = mm4.array(mfi);
            const auto& m5 = mm5.array(mfi);
#endif
#endif

            const Box& tbx = mfi.tilebox();
            const Box& vbx = mfi.validbox();
            const auto& solnfab = sol.array(mfi);
            const auto& rhsfab  = rhs.const_array(mfi);
            const auto& afab    = acoef.const_array(mfi);

            AMREX_D_TERM(const auto& bxfab = bxcoef.const_array(mfi);,
                         const auto& byfab = bycoef.const_array(mfi);,
                         const auto& bzfab = bzcoef.const_array(mfi););

            const auto& f0fab = f0.const_array(mfi);
            const auto& f1fab = f1.const_array(mfi);
#if (AMREX_SPACEDIM > 1)
            const auto& f2fab = f2.const_array(mfi);
            const auto& f3fab = f3.const_array(mfi);
#if (AMREX_SPACEDIM > 2)
            const auto& f4fab = f4.const_array(mfi);
            const auto& f5fab = f5.const_array(mfi);
#endif
#endif

            if (m_overset_mask[amrlev][mglev]) {
                const auto& osm = m_overset_mask[amrlev][mglev]->const_array(mfi);
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D(tbx, nc, i, j, k, n,
                {
                    abec_gsrb_os(i,j,k,n, solnfab, rhsfab, alpha, afab,
                                 AMREX_D_DECL(dhx, dhy, dhz),
                                 AMREX_D_DECL(bxfab, byfab, bzfab),
                                 AMREX_D_DECL(m0,m2,m4),
                                 AMREX_D_DECL(m1,m3,m5),
                                 AMREX_D_DECL(f0fab,f2fab,f4fab),
                                 AMREX_D_DECL(f1fab,f3fab,f5fab),
                                 osm, vbx, redblack);
                });
            } else if (regular_coarsening) {
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D(tbx, nc, i, j, k, n,
                {
                    abec_gsrb(i,j,k,n, solnfab, rhsfab, alpha, afab,
                              AMREX_D_DECL(dhx, dhy, dhz),
                              AMREX_D_DECL(bxfab, byfab, bzfab),
                              AMREX_D_DECL(m0,m2,m4),
                              AMREX_D_DECL(m1,m3,m5),
                              AMREX_D_DECL(f0fab,f2fab,f4fab),
                              AMREX_D_DECL(f1fab,f3fab,f5fab),
                              vbx, redblack);
                });
            } else {
                Gpu::LaunchSafeGuard lsg(false); // xxxxx gpu todo
                // line solve does not with with GPU
                AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( tbx, thread_box,
                {
                    abec_gsrb_with_line_solve(thread_box, solnfab, rhsfab, alpha, afab,
                                              AMREX_D_DECL(dhx, dhy, dhz),
                                              AMREX_D_DECL(bxfab, byfab, bzfab),
                                              AMREX_D_DECL(m0,m2,m4),
                                              AMREX_D_DECL(m1,m3,m5),
                                              AMREX_D_DECL(f0fab,f2fab,f4fab),
                                              AMREX_D_DECL(f1fab,f3fab,f5fab),
                                              vbx, redblack, nc);
                });
            }
        }
    }
}